

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  undefined1 (*pauVar5) [12];
  undefined4 uVar6;
  undefined8 uVar7;
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [12];
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  ulong uVar68;
  uint uVar69;
  uint uVar70;
  long lVar71;
  bool bVar72;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar88 [16];
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar105 [32];
  undefined1 auVar89 [16];
  undefined1 auVar106 [32];
  float fVar111;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar115;
  float fVar149;
  float fVar150;
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar116;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar126 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar182;
  float fVar195;
  float fVar196;
  vint4 ai_1;
  undefined1 auVar183 [16];
  float fVar198;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar197;
  float fVar199;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar200;
  undefined1 auVar194 [32];
  float fVar201;
  float fVar231;
  float fVar233;
  vint4 ai_2;
  undefined1 auVar203 [16];
  float fVar235;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar202;
  float fVar232;
  float fVar234;
  float fVar236;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar237;
  float fVar252;
  float fVar253;
  undefined1 auVar238 [16];
  float fVar255;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar254;
  float fVar256;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar257;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar267 [16];
  vint4 ai;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  float fVar279;
  float fVar280;
  float fVar297;
  float fVar299;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar298;
  float fVar300;
  float fVar301;
  undefined1 auVar296 [32];
  float fVar302;
  float fVar312;
  float fVar313;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  float fVar315;
  float fVar316;
  float fVar317;
  undefined1 auVar310 [32];
  float fVar314;
  undefined1 auVar311 [32];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [32];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  float fVar331;
  float fVar339;
  float fVar340;
  vfloat4 a0;
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  float fVar341;
  undefined1 auVar338 [16];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  float fVar353;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar360;
  undefined1 auVar359 [16];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float fStack_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_448 [16];
  undefined1 (*local_438) [16];
  Primitive *local_430;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  uint auStack_3c8 [4];
  RTCFilterFunctionNArguments local_3b8;
  undefined1 local_388 [32];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar266 [32];
  undefined1 auVar358 [32];
  
  PVar8 = prim[1];
  uVar65 = (ulong)(byte)PVar8;
  lVar66 = uVar65 * 0x25;
  fVar115 = *(float *)(prim + lVar66 + 0x12);
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar207 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar207 = vinsertps_avx(auVar207,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar93 = vsubps_avx(auVar93,*(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar117._0_4_ = fVar115 * auVar93._0_4_;
  auVar117._4_4_ = fVar115 * auVar93._4_4_;
  auVar117._8_4_ = fVar115 * auVar93._8_4_;
  auVar117._12_4_ = fVar115 * auVar93._12_4_;
  auVar268._0_4_ = fVar115 * auVar207._0_4_;
  auVar268._4_4_ = fVar115 * auVar207._4_4_;
  auVar268._8_4_ = fVar115 * auVar207._8_4_;
  auVar268._12_4_ = fVar115 * auVar207._12_4_;
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar207 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar177 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar177 = vcvtdq2ps_avx(auVar177);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + 6)));
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar65 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar167 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  auVar167 = vcvtdq2ps_avx(auVar167);
  auVar129 = vshufps_avx(auVar268,auVar268,0);
  auVar267 = vshufps_avx(auVar268,auVar268,0x55);
  auVar17 = vshufps_avx(auVar268,auVar268,0xaa);
  fVar115 = auVar17._0_4_;
  fVar116 = auVar17._4_4_;
  fVar149 = auVar17._8_4_;
  fVar150 = auVar17._12_4_;
  fVar201 = auVar267._0_4_;
  fVar231 = auVar267._4_4_;
  fVar233 = auVar267._8_4_;
  fVar235 = auVar267._12_4_;
  fVar182 = auVar129._0_4_;
  fVar195 = auVar129._4_4_;
  fVar196 = auVar129._8_4_;
  fVar198 = auVar129._12_4_;
  auVar332._0_4_ = fVar182 * auVar93._0_4_ + fVar201 * auVar207._0_4_ + fVar115 * auVar177._0_4_;
  auVar332._4_4_ = fVar195 * auVar93._4_4_ + fVar231 * auVar207._4_4_ + fVar116 * auVar177._4_4_;
  auVar332._8_4_ = fVar196 * auVar93._8_4_ + fVar233 * auVar207._8_4_ + fVar149 * auVar177._8_4_;
  auVar332._12_4_ = fVar198 * auVar93._12_4_ + fVar235 * auVar207._12_4_ + fVar150 * auVar177._12_4_
  ;
  auVar346._0_4_ = fVar182 * auVar214._0_4_ + fVar201 * auVar15._0_4_ + auVar16._0_4_ * fVar115;
  auVar346._4_4_ = fVar195 * auVar214._4_4_ + fVar231 * auVar15._4_4_ + auVar16._4_4_ * fVar116;
  auVar346._8_4_ = fVar196 * auVar214._8_4_ + fVar233 * auVar15._8_4_ + auVar16._8_4_ * fVar149;
  auVar346._12_4_ = fVar198 * auVar214._12_4_ + fVar235 * auVar15._12_4_ + auVar16._12_4_ * fVar150;
  auVar269._0_4_ = fVar182 * auVar139._0_4_ + fVar201 * auVar128._0_4_ + auVar167._0_4_ * fVar115;
  auVar269._4_4_ = fVar195 * auVar139._4_4_ + fVar231 * auVar128._4_4_ + auVar167._4_4_ * fVar116;
  auVar269._8_4_ = fVar196 * auVar139._8_4_ + fVar233 * auVar128._8_4_ + auVar167._8_4_ * fVar149;
  auVar269._12_4_ =
       fVar198 * auVar139._12_4_ + fVar235 * auVar128._12_4_ + auVar167._12_4_ * fVar150;
  auVar129 = vshufps_avx(auVar117,auVar117,0);
  auVar267 = vshufps_avx(auVar117,auVar117,0x55);
  auVar17 = vshufps_avx(auVar117,auVar117,0xaa);
  fVar115 = auVar17._0_4_;
  fVar116 = auVar17._4_4_;
  fVar149 = auVar17._8_4_;
  fVar150 = auVar17._12_4_;
  fVar201 = auVar267._0_4_;
  fVar231 = auVar267._4_4_;
  fVar233 = auVar267._8_4_;
  fVar235 = auVar267._12_4_;
  fVar182 = auVar129._0_4_;
  fVar195 = auVar129._4_4_;
  fVar196 = auVar129._8_4_;
  fVar198 = auVar129._12_4_;
  auVar118._0_4_ = fVar182 * auVar93._0_4_ + fVar201 * auVar207._0_4_ + fVar115 * auVar177._0_4_;
  auVar118._4_4_ = fVar195 * auVar93._4_4_ + fVar231 * auVar207._4_4_ + fVar116 * auVar177._4_4_;
  auVar118._8_4_ = fVar196 * auVar93._8_4_ + fVar233 * auVar207._8_4_ + fVar149 * auVar177._8_4_;
  auVar118._12_4_ = fVar198 * auVar93._12_4_ + fVar235 * auVar207._12_4_ + fVar150 * auVar177._12_4_
  ;
  auVar73._0_4_ = fVar182 * auVar214._0_4_ + auVar16._0_4_ * fVar115 + fVar201 * auVar15._0_4_;
  auVar73._4_4_ = fVar195 * auVar214._4_4_ + auVar16._4_4_ * fVar116 + fVar231 * auVar15._4_4_;
  auVar73._8_4_ = fVar196 * auVar214._8_4_ + auVar16._8_4_ * fVar149 + fVar233 * auVar15._8_4_;
  auVar73._12_4_ = fVar198 * auVar214._12_4_ + auVar16._12_4_ * fVar150 + fVar235 * auVar15._12_4_;
  auVar281._8_4_ = 0x7fffffff;
  auVar281._0_8_ = 0x7fffffff7fffffff;
  auVar281._12_4_ = 0x7fffffff;
  auVar93 = vandps_avx(auVar332,auVar281);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar93 = vcmpps_avx(auVar93,auVar203,1);
  auVar207 = vblendvps_avx(auVar332,auVar203,auVar93);
  auVar93 = vandps_avx(auVar346,auVar281);
  auVar93 = vcmpps_avx(auVar93,auVar203,1);
  auVar177 = vblendvps_avx(auVar346,auVar203,auVar93);
  auVar93 = vandps_avx(auVar281,auVar269);
  auVar93 = vcmpps_avx(auVar93,auVar203,1);
  auVar93 = vblendvps_avx(auVar269,auVar203,auVar93);
  auVar151._0_4_ = fVar182 * auVar139._0_4_ + fVar201 * auVar128._0_4_ + auVar167._0_4_ * fVar115;
  auVar151._4_4_ = fVar195 * auVar139._4_4_ + fVar231 * auVar128._4_4_ + auVar167._4_4_ * fVar116;
  auVar151._8_4_ = fVar196 * auVar139._8_4_ + fVar233 * auVar128._8_4_ + auVar167._8_4_ * fVar149;
  auVar151._12_4_ =
       fVar198 * auVar139._12_4_ + fVar235 * auVar128._12_4_ + auVar167._12_4_ * fVar150;
  auVar214 = vrcpps_avx(auVar207);
  fVar182 = auVar214._0_4_;
  auVar183._0_4_ = fVar182 * auVar207._0_4_;
  fVar195 = auVar214._4_4_;
  auVar183._4_4_ = fVar195 * auVar207._4_4_;
  fVar196 = auVar214._8_4_;
  auVar183._8_4_ = fVar196 * auVar207._8_4_;
  fVar198 = auVar214._12_4_;
  auVar183._12_4_ = fVar198 * auVar207._12_4_;
  auVar282._8_4_ = 0x3f800000;
  auVar282._0_8_ = 0x3f8000003f800000;
  auVar282._12_4_ = 0x3f800000;
  auVar207 = vsubps_avx(auVar282,auVar183);
  fVar182 = fVar182 + fVar182 * auVar207._0_4_;
  fVar195 = fVar195 + fVar195 * auVar207._4_4_;
  fVar196 = fVar196 + fVar196 * auVar207._8_4_;
  fVar198 = fVar198 + fVar198 * auVar207._12_4_;
  auVar207 = vrcpps_avx(auVar177);
  fVar201 = auVar207._0_4_;
  auVar238._0_4_ = fVar201 * auVar177._0_4_;
  fVar231 = auVar207._4_4_;
  auVar238._4_4_ = fVar231 * auVar177._4_4_;
  fVar233 = auVar207._8_4_;
  auVar238._8_4_ = fVar233 * auVar177._8_4_;
  fVar235 = auVar207._12_4_;
  auVar238._12_4_ = fVar235 * auVar177._12_4_;
  auVar207 = vsubps_avx(auVar282,auVar238);
  fVar201 = fVar201 + fVar201 * auVar207._0_4_;
  fVar231 = fVar231 + fVar231 * auVar207._4_4_;
  fVar233 = fVar233 + fVar233 * auVar207._8_4_;
  fVar235 = fVar235 + fVar235 * auVar207._12_4_;
  auVar207 = vrcpps_avx(auVar93);
  fVar237 = auVar207._0_4_;
  auVar258._0_4_ = fVar237 * auVar93._0_4_;
  fVar252 = auVar207._4_4_;
  auVar258._4_4_ = fVar252 * auVar93._4_4_;
  fVar253 = auVar207._8_4_;
  auVar258._8_4_ = fVar253 * auVar93._8_4_;
  fVar255 = auVar207._12_4_;
  auVar258._12_4_ = fVar255 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar282,auVar258);
  fVar237 = fVar237 + fVar237 * auVar93._0_4_;
  fVar252 = fVar252 + fVar252 * auVar93._4_4_;
  fVar253 = fVar253 + fVar253 * auVar93._8_4_;
  fVar255 = fVar255 + fVar255 * auVar93._12_4_;
  auVar93 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar66 + 0x16)) *
                          *(float *)(prim + lVar66 + 0x1a)));
  auVar177 = vshufps_avx(auVar93,auVar93,0);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar93 = vpmovsxwd_avx(auVar93);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar207 = vpmovsxwd_avx(auVar207);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar214 = vsubps_avx(auVar207,auVar93);
  fVar115 = auVar177._0_4_;
  fVar116 = auVar177._4_4_;
  fVar149 = auVar177._8_4_;
  fVar150 = auVar177._12_4_;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar207 = vpmovsxwd_avx(auVar177);
  auVar270._0_4_ = auVar214._0_4_ * fVar115 + auVar93._0_4_;
  auVar270._4_4_ = auVar214._4_4_ * fVar116 + auVar93._4_4_;
  auVar270._8_4_ = auVar214._8_4_ * fVar149 + auVar93._8_4_;
  auVar270._12_4_ = auVar214._12_4_ * fVar150 + auVar93._12_4_;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar177 = vpmovsxwd_avx(auVar214);
  auVar93 = vcvtdq2ps_avx(auVar207);
  auVar207 = vcvtdq2ps_avx(auVar177);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar283._0_4_ = auVar207._0_4_ * fVar115 + auVar93._0_4_;
  auVar283._4_4_ = auVar207._4_4_ * fVar116 + auVar93._4_4_;
  auVar283._8_4_ = auVar207._8_4_ * fVar149 + auVar93._8_4_;
  auVar283._12_4_ = auVar207._12_4_ * fVar150 + auVar93._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar93 = vpmovsxwd_avx(auVar15);
  uVar67 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar65 * 2 + uVar67 + 6);
  auVar207 = vpmovsxwd_avx(auVar16);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar303._0_4_ = auVar207._0_4_ * fVar115 + auVar93._0_4_;
  auVar303._4_4_ = auVar207._4_4_ * fVar116 + auVar93._4_4_;
  auVar303._8_4_ = auVar207._8_4_ * fVar149 + auVar93._8_4_;
  auVar303._12_4_ = auVar207._12_4_ * fVar150 + auVar93._12_4_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar93 = vpmovsxwd_avx(auVar139);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar207 = vpmovsxwd_avx(auVar128);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar177 = vsubps_avx(auVar207,auVar93);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar207 = vpmovsxwd_avx(auVar167);
  auVar318._0_4_ = auVar177._0_4_ * fVar115 + auVar93._0_4_;
  auVar318._4_4_ = auVar177._4_4_ * fVar116 + auVar93._4_4_;
  auVar318._8_4_ = auVar177._8_4_ * fVar149 + auVar93._8_4_;
  auVar318._12_4_ = auVar177._12_4_ * fVar150 + auVar93._12_4_;
  auVar93 = vcvtdq2ps_avx(auVar207);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar65 + (ulong)(byte)PVar8 * 0x20 + 6);
  auVar207 = vpmovsxwd_avx(auVar129);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar324._0_4_ = auVar207._0_4_ * fVar115 + auVar93._0_4_;
  auVar324._4_4_ = auVar207._4_4_ * fVar116 + auVar93._4_4_;
  auVar324._8_4_ = auVar207._8_4_ * fVar149 + auVar93._8_4_;
  auVar324._12_4_ = auVar207._12_4_ * fVar150 + auVar93._12_4_;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar8 * 0x20 - uVar65) + 6);
  auVar93 = vpmovsxwd_avx(auVar267);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar207 = vpmovsxwd_avx(auVar17);
  auVar207 = vcvtdq2ps_avx(auVar207);
  auVar207 = vsubps_avx(auVar207,auVar93);
  auVar259._0_4_ = auVar93._0_4_ + auVar207._0_4_ * fVar115;
  auVar259._4_4_ = auVar93._4_4_ + auVar207._4_4_ * fVar116;
  auVar259._8_4_ = auVar93._8_4_ + auVar207._8_4_ * fVar149;
  auVar259._12_4_ = auVar93._12_4_ + auVar207._12_4_ * fVar150;
  auVar93 = vsubps_avx(auVar270,auVar118);
  auVar271._0_4_ = fVar182 * auVar93._0_4_;
  auVar271._4_4_ = fVar195 * auVar93._4_4_;
  auVar271._8_4_ = fVar196 * auVar93._8_4_;
  auVar271._12_4_ = fVar198 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar283,auVar118);
  auVar119._0_4_ = fVar182 * auVar93._0_4_;
  auVar119._4_4_ = fVar195 * auVar93._4_4_;
  auVar119._8_4_ = fVar196 * auVar93._8_4_;
  auVar119._12_4_ = fVar198 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar303,auVar73);
  auVar184._0_4_ = fVar201 * auVar93._0_4_;
  auVar184._4_4_ = fVar231 * auVar93._4_4_;
  auVar184._8_4_ = fVar233 * auVar93._8_4_;
  auVar184._12_4_ = fVar235 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar318,auVar73);
  auVar74._0_4_ = fVar201 * auVar93._0_4_;
  auVar74._4_4_ = fVar231 * auVar93._4_4_;
  auVar74._8_4_ = fVar233 * auVar93._8_4_;
  auVar74._12_4_ = fVar235 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar324,auVar151);
  auVar204._0_4_ = fVar237 * auVar93._0_4_;
  auVar204._4_4_ = fVar252 * auVar93._4_4_;
  auVar204._8_4_ = fVar253 * auVar93._8_4_;
  auVar204._12_4_ = fVar255 * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar259,auVar151);
  auVar152._0_4_ = fVar237 * auVar93._0_4_;
  auVar152._4_4_ = fVar252 * auVar93._4_4_;
  auVar152._8_4_ = fVar253 * auVar93._8_4_;
  auVar152._12_4_ = fVar255 * auVar93._12_4_;
  auVar93 = vpminsd_avx(auVar271,auVar119);
  auVar207 = vpminsd_avx(auVar184,auVar74);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  auVar207 = vpminsd_avx(auVar204,auVar152);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar284._4_4_ = uVar6;
  auVar284._0_4_ = uVar6;
  auVar284._8_4_ = uVar6;
  auVar284._12_4_ = uVar6;
  auVar207 = vmaxps_avx(auVar207,auVar284);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  local_2f8._0_4_ = auVar93._0_4_ * 0.99999964;
  local_2f8._4_4_ = auVar93._4_4_ * 0.99999964;
  local_2f8._8_4_ = auVar93._8_4_ * 0.99999964;
  local_2f8._12_4_ = auVar93._12_4_ * 0.99999964;
  auVar93 = vpmaxsd_avx(auVar271,auVar119);
  auVar207 = vpmaxsd_avx(auVar184,auVar74);
  auVar93 = vminps_avx(auVar93,auVar207);
  auVar207 = vpmaxsd_avx(auVar204,auVar152);
  uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar153._4_4_ = uVar6;
  auVar153._0_4_ = uVar6;
  auVar153._8_4_ = uVar6;
  auVar153._12_4_ = uVar6;
  auVar207 = vminps_avx(auVar207,auVar153);
  auVar93 = vminps_avx(auVar93,auVar207);
  auVar75._0_4_ = auVar93._0_4_ * 1.0000004;
  auVar75._4_4_ = auVar93._4_4_ * 1.0000004;
  auVar75._8_4_ = auVar93._8_4_ * 1.0000004;
  auVar75._12_4_ = auVar93._12_4_ * 1.0000004;
  auVar93 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar207 = vpcmpgtd_avx(auVar93,_DAT_01f7fcf0);
  auVar93 = vcmpps_avx(local_2f8,auVar75,2);
  auVar93 = vandps_avx(auVar93,auVar207);
  uVar63 = vmovmskps_avx(auVar93);
  if (uVar63 == 0) {
    uVar65 = 0;
LAB_00f59ff4:
    return (bool)((byte)uVar65 & 1);
  }
  uVar63 = uVar63 & 0xff;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  local_438 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_430 = prim;
LAB_00f57c70:
  lVar66 = 0;
  if (uVar63 != 0) {
    for (; (uVar63 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
    }
  }
  uVar64 = *(uint *)(local_430 + 2);
  pGVar9 = (context->scene->geometries).items[uVar64].ptr;
  fVar115 = (pGVar9->time_range).lower;
  fVar115 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar115) / ((pGVar9->time_range).upper - fVar115));
  auVar93 = vroundss_avx(ZEXT416((uint)fVar115),ZEXT416((uint)fVar115),9);
  auVar93 = vminss_avx(auVar93,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar93 = vmaxss_avx(ZEXT816(0) << 0x20,auVar93);
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           (ulong)*(uint *)(local_430 + lVar66 * 4 + 6) *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar93._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + lVar71);
  lVar12 = *(long *)(_Var10 + 0x10 + lVar71);
  pfVar4 = (float *)(lVar11 + lVar12 * uVar65);
  fVar116 = *pfVar4;
  fVar149 = pfVar4[1];
  fVar150 = pfVar4[2];
  fVar182 = pfVar4[3];
  lVar1 = uVar65 + 1;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar1);
  fVar195 = *pfVar4;
  fVar196 = pfVar4[1];
  fVar198 = pfVar4[2];
  fVar201 = pfVar4[3];
  lVar2 = uVar65 + 2;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar231 = *pfVar4;
  fVar233 = pfVar4[1];
  fVar235 = pfVar4[2];
  fVar237 = pfVar4[3];
  lVar3 = uVar65 + 3;
  pfVar4 = (float *)(lVar11 + lVar12 * lVar3);
  fVar252 = *pfVar4;
  fVar253 = pfVar4[1];
  fVar255 = pfVar4[2];
  fVar197 = pfVar4[3];
  lVar11 = *(long *)&pGVar9[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar11 + lVar71);
  lVar13 = *(long *)(lVar11 + 0x10 + lVar71);
  pfVar4 = (float *)(lVar12 + lVar13 * uVar65);
  fVar199 = *pfVar4;
  fVar202 = pfVar4[1];
  fVar232 = pfVar4[2];
  fVar234 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar236 = *pfVar4;
  fVar254 = pfVar4[1];
  fVar256 = pfVar4[2];
  fVar111 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar112 = *pfVar4;
  fVar113 = pfVar4[1];
  fVar114 = pfVar4[2];
  fVar200 = pfVar4[3];
  fVar115 = fVar115 - auVar93._0_4_;
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar257 = *pfVar4;
  fVar279 = pfVar4[1];
  fVar280 = pfVar4[2];
  fVar297 = pfVar4[3];
  local_598._0_4_ =
       fVar116 * 0.16666667 + fVar195 * 0.6666667 + fVar231 * 0.16666667 + fVar252 * 0.0;
  local_598._4_4_ =
       fVar149 * 0.16666667 + fVar196 * 0.6666667 + fVar233 * 0.16666667 + fVar253 * 0.0;
  fStack_590 = fVar150 * 0.16666667 + fVar198 * 0.6666667 + fVar235 * 0.16666667 + fVar255 * 0.0;
  fStack_58c = fVar182 * 0.16666667 + fVar201 * 0.6666667 + fVar237 * 0.16666667 + fVar197 * 0.0;
  auVar76._0_4_ = fVar231 * 0.5 + fVar252 * 0.0;
  auVar76._4_4_ = fVar233 * 0.5 + fVar253 * 0.0;
  auVar76._8_4_ = fVar235 * 0.5 + fVar255 * 0.0;
  auVar76._12_4_ = fVar237 * 0.5 + fVar197 * 0.0;
  auVar154._0_4_ = fVar195 * 0.0;
  auVar154._4_4_ = fVar196 * 0.0;
  auVar154._8_4_ = fVar198 * 0.0;
  auVar154._12_4_ = fVar201 * 0.0;
  auVar93 = vsubps_avx(auVar76,auVar154);
  auVar155._0_4_ = fVar116 * 0.5;
  auVar155._4_4_ = fVar149 * 0.5;
  auVar155._8_4_ = fVar150 * 0.5;
  auVar155._12_4_ = fVar182 * 0.5;
  auVar128 = vsubps_avx(auVar93,auVar155);
  auVar77._0_4_ = fVar199 * 0.16666667 + fVar236 * 0.6666667 + fVar112 * 0.16666667 + fVar257 * 0.0;
  auVar77._4_4_ = fVar202 * 0.16666667 + fVar254 * 0.6666667 + fVar113 * 0.16666667 + fVar279 * 0.0;
  auVar77._8_4_ = fVar232 * 0.16666667 + fVar256 * 0.6666667 + fVar114 * 0.16666667 + fVar280 * 0.0;
  auVar77._12_4_ = fVar234 * 0.16666667 + fVar111 * 0.6666667 + fVar200 * 0.16666667 + fVar297 * 0.0
  ;
  auVar260._0_4_ = fVar112 * 0.5 + fVar257 * 0.0;
  auVar260._4_4_ = fVar113 * 0.5 + fVar279 * 0.0;
  auVar260._8_4_ = fVar114 * 0.5 + fVar280 * 0.0;
  auVar260._12_4_ = fVar200 * 0.5 + fVar297 * 0.0;
  auVar333._0_4_ = fVar236 * 0.0;
  auVar333._4_4_ = fVar254 * 0.0;
  auVar333._8_4_ = fVar256 * 0.0;
  auVar333._12_4_ = fVar111 * 0.0;
  auVar93 = vsubps_avx(auVar260,auVar333);
  auVar334._0_4_ = fVar199 * 0.5;
  auVar334._4_4_ = fVar202 * 0.5;
  auVar334._8_4_ = fVar232 * 0.5;
  auVar334._12_4_ = fVar234 * 0.5;
  auVar214 = vsubps_avx(auVar93,auVar334);
  auVar205._0_4_ = fVar116 * 0.0;
  auVar205._4_4_ = fVar149 * 0.0;
  auVar205._8_4_ = fVar150 * 0.0;
  auVar205._12_4_ = fVar182 * 0.0;
  auVar261._0_4_ =
       auVar205._0_4_ + fVar195 * 0.16666667 + fVar231 * 0.6666667 + fVar252 * 0.16666667;
  auVar261._4_4_ =
       auVar205._4_4_ + fVar196 * 0.16666667 + fVar233 * 0.6666667 + fVar253 * 0.16666667;
  auVar261._8_4_ =
       auVar205._8_4_ + fVar198 * 0.16666667 + fVar235 * 0.6666667 + fVar255 * 0.16666667;
  auVar261._12_4_ =
       auVar205._12_4_ + fVar201 * 0.16666667 + fVar237 * 0.6666667 + fVar197 * 0.16666667;
  auVar272._0_4_ = fVar252 * 0.5 + fVar231 * 0.0;
  auVar272._4_4_ = fVar253 * 0.5 + fVar233 * 0.0;
  auVar272._8_4_ = fVar255 * 0.5 + fVar235 * 0.0;
  auVar272._12_4_ = fVar197 * 0.5 + fVar237 * 0.0;
  auVar185._0_4_ = fVar195 * 0.5;
  auVar185._4_4_ = fVar196 * 0.5;
  auVar185._8_4_ = fVar198 * 0.5;
  auVar185._12_4_ = fVar201 * 0.5;
  auVar93 = vsubps_avx(auVar272,auVar185);
  auVar167 = vsubps_avx(auVar93,auVar205);
  auVar206._0_4_ = fVar199 * 0.0;
  auVar206._4_4_ = fVar202 * 0.0;
  auVar206._8_4_ = fVar232 * 0.0;
  auVar206._12_4_ = fVar234 * 0.0;
  auVar186._0_4_ =
       auVar206._0_4_ + fVar236 * 0.16666667 + fVar112 * 0.6666667 + fVar257 * 0.16666667;
  auVar186._4_4_ =
       auVar206._4_4_ + fVar254 * 0.16666667 + fVar113 * 0.6666667 + fVar279 * 0.16666667;
  auVar186._8_4_ =
       auVar206._8_4_ + fVar256 * 0.16666667 + fVar114 * 0.6666667 + fVar280 * 0.16666667;
  auVar186._12_4_ =
       auVar206._12_4_ + fVar111 * 0.16666667 + fVar200 * 0.6666667 + fVar297 * 0.16666667;
  auVar273._0_4_ = fVar112 * 0.0 + fVar257 * 0.5;
  auVar273._4_4_ = fVar113 * 0.0 + fVar279 * 0.5;
  auVar273._8_4_ = fVar114 * 0.0 + fVar280 * 0.5;
  auVar273._12_4_ = fVar200 * 0.0 + fVar297 * 0.5;
  auVar239._0_4_ = fVar236 * 0.5;
  auVar239._4_4_ = fVar254 * 0.5;
  auVar239._8_4_ = fVar256 * 0.5;
  auVar239._12_4_ = fVar111 * 0.5;
  auVar93 = vsubps_avx(auVar273,auVar239);
  auVar16 = vsubps_avx(auVar93,auVar206);
  auVar93 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar207 = vshufps_avx(auVar77,auVar77,0xc9);
  fVar113 = auVar128._0_4_;
  auVar240._0_4_ = fVar113 * auVar207._0_4_;
  fVar114 = auVar128._4_4_;
  auVar240._4_4_ = fVar114 * auVar207._4_4_;
  fVar200 = auVar128._8_4_;
  auVar240._8_4_ = fVar200 * auVar207._8_4_;
  fVar257 = auVar128._12_4_;
  auVar240._12_4_ = fVar257 * auVar207._12_4_;
  auVar78._0_4_ = auVar93._0_4_ * auVar77._0_4_;
  auVar78._4_4_ = auVar93._4_4_ * auVar77._4_4_;
  auVar78._8_4_ = auVar93._8_4_ * auVar77._8_4_;
  auVar78._12_4_ = auVar93._12_4_ * auVar77._12_4_;
  auVar207 = vsubps_avx(auVar78,auVar240);
  auVar177 = vshufps_avx(auVar207,auVar207,0xc9);
  auVar207 = vshufps_avx(auVar214,auVar214,0xc9);
  auVar79._0_4_ = fVar113 * auVar207._0_4_;
  auVar79._4_4_ = fVar114 * auVar207._4_4_;
  auVar79._8_4_ = fVar200 * auVar207._8_4_;
  auVar79._12_4_ = fVar257 * auVar207._12_4_;
  auVar274._0_4_ = auVar214._0_4_ * auVar93._0_4_;
  auVar274._4_4_ = auVar214._4_4_ * auVar93._4_4_;
  auVar274._8_4_ = auVar214._8_4_ * auVar93._8_4_;
  auVar274._12_4_ = auVar214._12_4_ * auVar93._12_4_;
  auVar93 = vsubps_avx(auVar274,auVar79);
  auVar214 = vshufps_avx(auVar93,auVar93,0xc9);
  auVar207 = vshufps_avx(auVar167,auVar167,0xc9);
  auVar93 = vshufps_avx(auVar186,auVar186,0xc9);
  fVar279 = auVar167._0_4_;
  auVar285._0_4_ = fVar279 * auVar93._0_4_;
  fVar280 = auVar167._4_4_;
  auVar285._4_4_ = fVar280 * auVar93._4_4_;
  fVar297 = auVar167._8_4_;
  auVar285._8_4_ = fVar297 * auVar93._8_4_;
  fVar298 = auVar167._12_4_;
  auVar285._12_4_ = fVar298 * auVar93._12_4_;
  auVar187._0_4_ = auVar207._0_4_ * auVar186._0_4_;
  auVar187._4_4_ = auVar207._4_4_ * auVar186._4_4_;
  auVar187._8_4_ = auVar207._8_4_ * auVar186._8_4_;
  auVar187._12_4_ = auVar207._12_4_ * auVar186._12_4_;
  auVar93 = vsubps_avx(auVar187,auVar285);
  auVar15 = vshufps_avx(auVar93,auVar93,0xc9);
  auVar93 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar286._0_4_ = fVar279 * auVar93._0_4_;
  auVar286._4_4_ = fVar280 * auVar93._4_4_;
  auVar286._8_4_ = fVar297 * auVar93._8_4_;
  auVar286._12_4_ = fVar298 * auVar93._12_4_;
  auVar93 = vdpps_avx(auVar177,auVar177,0x7f);
  auVar80._0_4_ = auVar207._0_4_ * auVar16._0_4_;
  auVar80._4_4_ = auVar207._4_4_ * auVar16._4_4_;
  auVar80._8_4_ = auVar207._8_4_ * auVar16._8_4_;
  auVar80._12_4_ = auVar207._12_4_ * auVar16._12_4_;
  auVar207 = vsubps_avx(auVar80,auVar286);
  auVar16 = vshufps_avx(auVar207,auVar207,0xc9);
  fVar149 = auVar93._0_4_;
  auVar267 = ZEXT416((uint)fVar149);
  auVar207 = vrsqrtss_avx(auVar267,auVar267);
  fVar116 = auVar207._0_4_;
  auVar207 = ZEXT416((uint)(fVar116 * 1.5 - fVar149 * 0.5 * fVar116 * fVar116 * fVar116));
  auVar139 = vshufps_avx(auVar207,auVar207,0);
  auVar207 = vdpps_avx(auVar177,auVar214,0x7f);
  fVar202 = auVar139._0_4_ * auVar177._0_4_;
  fVar232 = auVar139._4_4_ * auVar177._4_4_;
  fVar234 = auVar139._8_4_ * auVar177._8_4_;
  fVar236 = auVar139._12_4_ * auVar177._12_4_;
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar275._0_4_ = auVar93._0_4_ * auVar214._0_4_;
  auVar275._4_4_ = auVar93._4_4_ * auVar214._4_4_;
  auVar275._8_4_ = auVar93._8_4_ * auVar214._8_4_;
  auVar275._12_4_ = auVar93._12_4_ * auVar214._12_4_;
  auVar93 = vshufps_avx(auVar207,auVar207,0);
  auVar241._0_4_ = auVar93._0_4_ * auVar177._0_4_;
  auVar241._4_4_ = auVar93._4_4_ * auVar177._4_4_;
  auVar241._8_4_ = auVar93._8_4_ * auVar177._8_4_;
  auVar241._12_4_ = auVar93._12_4_ * auVar177._12_4_;
  auVar129 = vsubps_avx(auVar275,auVar241);
  auVar93 = vrcpss_avx(auVar267,auVar267);
  auVar93 = ZEXT416((uint)((2.0 - fVar149 * auVar93._0_4_) * auVar93._0_4_));
  auVar177 = vshufps_avx(auVar93,auVar93,0);
  auVar93 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar254 = auVar93._0_4_;
  auVar214 = ZEXT416((uint)fVar254);
  auVar207 = vrsqrtss_avx(auVar214,auVar214);
  fVar253 = auVar207._0_4_;
  auVar207 = vdpps_avx(auVar15,auVar16,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar359._0_4_ = auVar93._0_4_ * auVar16._0_4_;
  auVar359._4_4_ = auVar93._4_4_ * auVar16._4_4_;
  auVar359._8_4_ = auVar93._8_4_ * auVar16._8_4_;
  auVar359._12_4_ = auVar93._12_4_ * auVar16._12_4_;
  lVar12 = *(long *)(_Var10 + 0x38 + lVar71);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar71);
  pauVar5 = (undefined1 (*) [12])(lVar12 + lVar13 * uVar65);
  auVar62 = *pauVar5;
  fVar116 = *(float *)pauVar5[1];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar1);
  fVar149 = *pfVar4;
  fVar150 = pfVar4[1];
  fVar182 = pfVar4[2];
  fVar195 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + lVar13 * lVar2);
  fVar196 = *pfVar4;
  fVar198 = pfVar4[1];
  fVar201 = pfVar4[2];
  fVar231 = pfVar4[3];
  auVar93 = vshufps_avx(auVar207,auVar207,0);
  auVar81._0_4_ = auVar93._0_4_ * auVar15._0_4_;
  auVar81._4_4_ = auVar93._4_4_ * auVar15._4_4_;
  auVar81._8_4_ = auVar93._8_4_ * auVar15._8_4_;
  auVar81._12_4_ = auVar93._12_4_ * auVar15._12_4_;
  auVar16 = vsubps_avx(auVar359,auVar81);
  pfVar4 = (float *)(lVar12 + lVar13 * lVar3);
  fVar233 = *pfVar4;
  fVar235 = pfVar4[1];
  fVar237 = pfVar4[2];
  fVar252 = pfVar4[3];
  lVar12 = *(long *)(lVar11 + 0x38 + lVar71);
  lVar11 = *(long *)(lVar11 + 0x48 + lVar71);
  auVar93 = ZEXT416((uint)(fVar253 * 1.5 - fVar254 * 0.5 * fVar253 * fVar253 * fVar253));
  auVar207 = vshufps_avx(auVar93,auVar93,0);
  fVar253 = auVar207._0_4_ * auVar15._0_4_;
  fVar255 = auVar207._4_4_ * auVar15._4_4_;
  fVar197 = auVar207._8_4_ * auVar15._8_4_;
  fVar199 = auVar207._12_4_ * auVar15._12_4_;
  auVar93 = vrcpss_avx(auVar214,auVar214);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - auVar93._0_4_ * fVar254)));
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar214 = vshufps_avx(_local_598,_local_598,0xff);
  auVar319._0_4_ = auVar214._0_4_ * fVar202;
  auVar319._4_4_ = auVar214._4_4_ * fVar232;
  auVar319._8_4_ = auVar214._8_4_ * fVar234;
  auVar319._12_4_ = auVar214._12_4_ * fVar236;
  auVar15 = vshufps_avx(auVar128,auVar128,0xff);
  auVar267 = vsubps_avx(_local_598,auVar319);
  auVar208._0_4_ =
       auVar15._0_4_ * fVar202 + auVar214._0_4_ * auVar139._0_4_ * auVar129._0_4_ * auVar177._0_4_;
  auVar208._4_4_ =
       auVar15._4_4_ * fVar232 + auVar214._4_4_ * auVar139._4_4_ * auVar129._4_4_ * auVar177._4_4_;
  auVar208._8_4_ =
       auVar15._8_4_ * fVar234 + auVar214._8_4_ * auVar139._8_4_ * auVar129._8_4_ * auVar177._8_4_;
  auVar208._12_4_ =
       auVar15._12_4_ * fVar236 +
       auVar214._12_4_ * auVar139._12_4_ * auVar129._12_4_ * auVar177._12_4_;
  auVar139 = vsubps_avx(auVar128,auVar208);
  local_598._0_4_ = (float)local_598._0_4_ + auVar319._0_4_;
  local_598._4_4_ = (float)local_598._4_4_ + auVar319._4_4_;
  fStack_590 = fStack_590 + auVar319._8_4_;
  fStack_58c = fStack_58c + auVar319._12_4_;
  auVar177 = vshufps_avx(auVar261,auVar261,0xff);
  auVar156._0_4_ = auVar177._0_4_ * fVar253;
  auVar156._4_4_ = auVar177._4_4_ * fVar255;
  auVar156._8_4_ = auVar177._8_4_ * fVar197;
  auVar156._12_4_ = auVar177._12_4_ * fVar199;
  auVar214 = vshufps_avx(auVar167,auVar167,0xff);
  auVar128 = vsubps_avx(auVar261,auVar156);
  auVar82._0_4_ =
       auVar214._0_4_ * fVar253 + auVar177._0_4_ * auVar207._0_4_ * auVar16._0_4_ * auVar93._0_4_;
  auVar82._4_4_ =
       auVar214._4_4_ * fVar255 + auVar177._4_4_ * auVar207._4_4_ * auVar16._4_4_ * auVar93._4_4_;
  auVar82._8_4_ =
       auVar214._8_4_ * fVar197 + auVar177._8_4_ * auVar207._8_4_ * auVar16._8_4_ * auVar93._8_4_;
  auVar82._12_4_ =
       auVar214._12_4_ * fVar199 +
       auVar177._12_4_ * auVar207._12_4_ * auVar16._12_4_ * auVar93._12_4_;
  auVar167 = vsubps_avx(auVar167,auVar82);
  local_5c8._4_4_ = auVar261._4_4_ + auVar156._4_4_;
  local_5c8._0_4_ = auVar261._0_4_ + auVar156._0_4_;
  fStack_5c0 = auVar261._8_4_ + auVar156._8_4_;
  fStack_5bc = auVar261._12_4_ + auVar156._12_4_;
  local_5f8._0_4_ =
       *(float *)*pauVar5 * 0.16666667 + fVar149 * 0.6666667 + fVar196 * 0.16666667 + fVar233 * 0.0;
  local_5f8._4_4_ =
       *(float *)(*pauVar5 + 4) * 0.16666667 +
       fVar150 * 0.6666667 + fVar198 * 0.16666667 + fVar235 * 0.0;
  fStack_5f0 = *(float *)(*pauVar5 + 8) * 0.16666667 +
               fVar182 * 0.6666667 + fVar201 * 0.16666667 + fVar237 * 0.0;
  fStack_5ec = fVar116 * 0.16666667 + fVar195 * 0.6666667 + fVar231 * 0.16666667 + fVar252 * 0.0;
  auVar83._0_4_ = fVar196 * 0.5 + fVar233 * 0.0;
  auVar83._4_4_ = fVar198 * 0.5 + fVar235 * 0.0;
  auVar83._8_4_ = fVar201 * 0.5 + fVar237 * 0.0;
  auVar83._12_4_ = fVar231 * 0.5 + fVar252 * 0.0;
  auVar120._0_4_ = fVar149 * 0.0;
  auVar120._4_4_ = fVar150 * 0.0;
  auVar120._8_4_ = fVar182 * 0.0;
  auVar120._12_4_ = fVar195 * 0.0;
  auVar93 = vsubps_avx(auVar83,auVar120);
  auVar121._0_4_ = *(float *)*pauVar5 * 0.5;
  auVar121._4_4_ = *(float *)(*pauVar5 + 4) * 0.5;
  auVar121._8_4_ = *(float *)(*pauVar5 + 8) * 0.5;
  auVar121._12_4_ = fVar116 * 0.5;
  auVar129 = vsubps_avx(auVar93,auVar121);
  auVar93 = *(undefined1 (*) [16])(lVar12 + lVar2 * lVar11);
  pfVar4 = (float *)(lVar12 + lVar11 * lVar3);
  fVar253 = *pfVar4;
  fVar255 = pfVar4[1];
  fVar197 = pfVar4[2];
  fVar199 = pfVar4[3];
  fVar331 = auVar93._0_4_;
  fVar299 = auVar93._4_4_;
  fVar339 = auVar93._8_4_;
  fVar300 = auVar93._12_4_;
  pfVar4 = (float *)(lVar12 + lVar1 * lVar11);
  fVar202 = *pfVar4;
  fVar232 = pfVar4[1];
  fVar234 = pfVar4[2];
  fVar236 = pfVar4[3];
  pfVar4 = (float *)(lVar12 + uVar65 * lVar11);
  fVar254 = *pfVar4;
  fVar256 = pfVar4[1];
  fVar111 = pfVar4[2];
  fVar112 = pfVar4[3];
  auVar209._0_4_ = fVar254 * 0.16666667 + fVar202 * 0.6666667 + fVar331 * 0.16666667 + fVar253 * 0.0
  ;
  auVar209._4_4_ = fVar256 * 0.16666667 + fVar232 * 0.6666667 + fVar299 * 0.16666667 + fVar255 * 0.0
  ;
  auVar209._8_4_ = fVar111 * 0.16666667 + fVar234 * 0.6666667 + fVar339 * 0.16666667 + fVar197 * 0.0
  ;
  auVar209._12_4_ =
       fVar112 * 0.16666667 + fVar236 * 0.6666667 + fVar300 * 0.16666667 + fVar199 * 0.0;
  auVar188._0_4_ = fVar331 * 0.5 + fVar253 * 0.0;
  auVar188._4_4_ = fVar299 * 0.5 + fVar255 * 0.0;
  auVar188._8_4_ = fVar339 * 0.5 + fVar197 * 0.0;
  auVar188._12_4_ = fVar300 * 0.5 + fVar199 * 0.0;
  auVar287._0_4_ = fVar202 * 0.0;
  auVar287._4_4_ = fVar232 * 0.0;
  auVar287._8_4_ = fVar234 * 0.0;
  auVar287._12_4_ = fVar236 * 0.0;
  auVar93 = vsubps_avx(auVar188,auVar287);
  auVar288._0_4_ = fVar254 * 0.5;
  auVar288._4_4_ = fVar256 * 0.5;
  auVar288._8_4_ = fVar111 * 0.5;
  auVar288._12_4_ = fVar112 * 0.5;
  auVar207 = vsubps_avx(auVar93,auVar288);
  auVar289._0_4_ = fVar196 * 0.0 + fVar233 * 0.5;
  auVar289._4_4_ = fVar198 * 0.0 + fVar235 * 0.5;
  auVar289._8_4_ = fVar201 * 0.0 + fVar237 * 0.5;
  auVar289._12_4_ = fVar231 * 0.0 + fVar252 * 0.5;
  auVar335._0_4_ = fVar149 * 0.5;
  auVar335._4_4_ = fVar150 * 0.5;
  auVar335._8_4_ = fVar182 * 0.5;
  auVar335._12_4_ = fVar195 * 0.5;
  auVar93 = vsubps_avx(auVar289,auVar335);
  local_5d8 = auVar62._0_4_;
  fStack_5d4 = auVar62._4_4_;
  fStack_5d0 = auVar62._8_4_;
  auVar325._0_4_ = local_5d8 * 0.0;
  auVar325._4_4_ = fStack_5d4 * 0.0;
  auVar325._8_4_ = fStack_5d0 * 0.0;
  auVar325._12_4_ = fVar116 * 0.0;
  auVar336._0_4_ =
       auVar325._0_4_ + fVar149 * 0.16666667 + fVar233 * 0.16666667 + fVar196 * 0.6666667;
  auVar336._4_4_ =
       auVar325._4_4_ + fVar150 * 0.16666667 + fVar235 * 0.16666667 + fVar198 * 0.6666667;
  auVar336._8_4_ =
       auVar325._8_4_ + fVar182 * 0.16666667 + fVar237 * 0.16666667 + fVar201 * 0.6666667;
  auVar336._12_4_ =
       auVar325._12_4_ + fVar195 * 0.16666667 + fVar252 * 0.16666667 + fVar231 * 0.6666667;
  auVar17 = vsubps_avx(auVar93,auVar325);
  auVar157._0_4_ = fVar331 * 0.0 + fVar253 * 0.5;
  auVar157._4_4_ = fVar299 * 0.0 + fVar255 * 0.5;
  auVar157._8_4_ = fVar339 * 0.0 + fVar197 * 0.5;
  auVar157._12_4_ = fVar300 * 0.0 + fVar199 * 0.5;
  auVar84._0_4_ = fVar202 * 0.5;
  auVar84._4_4_ = fVar232 * 0.5;
  auVar84._8_4_ = fVar234 * 0.5;
  auVar84._12_4_ = fVar236 * 0.5;
  auVar93 = vsubps_avx(auVar157,auVar84);
  auVar122._0_4_ = fVar254 * 0.0;
  auVar122._4_4_ = fVar256 * 0.0;
  auVar122._8_4_ = fVar111 * 0.0;
  auVar122._12_4_ = fVar112 * 0.0;
  auVar158._0_4_ =
       auVar122._0_4_ + fVar202 * 0.16666667 + fVar331 * 0.6666667 + fVar253 * 0.16666667;
  auVar158._4_4_ =
       auVar122._4_4_ + fVar232 * 0.16666667 + fVar299 * 0.6666667 + fVar255 * 0.16666667;
  auVar158._8_4_ =
       auVar122._8_4_ + fVar234 * 0.16666667 + fVar339 * 0.6666667 + fVar197 * 0.16666667;
  auVar158._12_4_ =
       auVar122._12_4_ + fVar236 * 0.16666667 + fVar300 * 0.6666667 + fVar199 * 0.16666667;
  auVar214 = vsubps_avx(auVar93,auVar122);
  auVar93 = vshufps_avx(auVar209,auVar209,0xc9);
  fVar231 = auVar129._0_4_;
  auVar123._0_4_ = fVar231 * auVar93._0_4_;
  fVar233 = auVar129._4_4_;
  auVar123._4_4_ = fVar233 * auVar93._4_4_;
  fVar235 = auVar129._8_4_;
  auVar123._8_4_ = fVar235 * auVar93._8_4_;
  fVar252 = auVar129._12_4_;
  auVar123._12_4_ = fVar252 * auVar93._12_4_;
  auVar93 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar210._0_4_ = auVar93._0_4_ * auVar209._0_4_;
  auVar210._4_4_ = auVar93._4_4_ * auVar209._4_4_;
  auVar210._8_4_ = auVar93._8_4_ * auVar209._8_4_;
  auVar210._12_4_ = auVar93._12_4_ * auVar209._12_4_;
  auVar177 = vsubps_avx(auVar210,auVar123);
  auVar211._0_4_ = auVar93._0_4_ * auVar207._0_4_;
  auVar211._4_4_ = auVar93._4_4_ * auVar207._4_4_;
  auVar211._8_4_ = auVar93._8_4_ * auVar207._8_4_;
  auVar211._12_4_ = auVar93._12_4_ * auVar207._12_4_;
  auVar93 = vshufps_avx(auVar207,auVar207,0xc9);
  auVar189._0_4_ = fVar231 * auVar93._0_4_;
  auVar189._4_4_ = fVar233 * auVar93._4_4_;
  auVar189._8_4_ = fVar235 * auVar93._8_4_;
  auVar189._12_4_ = fVar252 * auVar93._12_4_;
  auVar15 = vsubps_avx(auVar211,auVar189);
  auVar93 = vshufps_avx(auVar158,auVar158,0xc9);
  fVar237 = auVar17._0_4_;
  auVar212._0_4_ = fVar237 * auVar93._0_4_;
  fVar253 = auVar17._4_4_;
  auVar212._4_4_ = fVar253 * auVar93._4_4_;
  fVar255 = auVar17._8_4_;
  auVar212._8_4_ = fVar255 * auVar93._8_4_;
  fVar197 = auVar17._12_4_;
  auVar212._12_4_ = fVar197 * auVar93._12_4_;
  auVar93 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar159._0_4_ = auVar93._0_4_ * auVar158._0_4_;
  auVar159._4_4_ = auVar93._4_4_ * auVar158._4_4_;
  auVar159._8_4_ = auVar93._8_4_ * auVar158._8_4_;
  auVar159._12_4_ = auVar93._12_4_ * auVar158._12_4_;
  auVar16 = vsubps_avx(auVar159,auVar212);
  auVar177 = vshufps_avx(auVar177,auVar177,0xc9);
  auVar213._0_4_ = auVar93._0_4_ * auVar214._0_4_;
  auVar213._4_4_ = auVar93._4_4_ * auVar214._4_4_;
  auVar213._8_4_ = auVar93._8_4_ * auVar214._8_4_;
  auVar213._12_4_ = auVar93._12_4_ * auVar214._12_4_;
  auVar93 = vshufps_avx(auVar214,auVar214,0xc9);
  auVar85._0_4_ = fVar237 * auVar93._0_4_;
  auVar85._4_4_ = fVar253 * auVar93._4_4_;
  auVar85._8_4_ = fVar255 * auVar93._8_4_;
  auVar85._12_4_ = fVar197 * auVar93._12_4_;
  auVar93 = vdpps_avx(auVar177,auVar177,0x7f);
  auVar73 = vsubps_avx(auVar213,auVar85);
  fVar116 = auVar93._0_4_;
  auVar214 = ZEXT416((uint)fVar116);
  auVar207 = vrsqrtss_avx(auVar214,auVar214);
  fVar149 = auVar207._0_4_;
  auVar207 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar347._0_4_ = auVar93._0_4_ * auVar207._0_4_;
  auVar347._4_4_ = auVar93._4_4_ * auVar207._4_4_;
  auVar347._8_4_ = auVar93._8_4_ * auVar207._8_4_;
  auVar347._12_4_ = auVar93._12_4_ * auVar207._12_4_;
  auVar93 = vdpps_avx(auVar177,auVar207,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar190._0_4_ = auVar93._0_4_ * auVar177._0_4_;
  auVar190._4_4_ = auVar93._4_4_ * auVar177._4_4_;
  auVar190._8_4_ = auVar93._8_4_ * auVar177._8_4_;
  auVar190._12_4_ = auVar93._12_4_ * auVar177._12_4_;
  auVar74 = vsubps_avx(auVar347,auVar190);
  auVar93 = vrcpss_avx(auVar214,auVar214);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar116 * auVar93._0_4_)));
  auVar214 = vshufps_avx(auVar93,auVar93,0);
  auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar93 = ZEXT416((uint)(fVar149 * 1.5 - fVar116 * 0.5 * fVar149 * fVar149 * fVar149));
  auVar16 = vshufps_avx(auVar93,auVar93,0);
  fVar116 = auVar177._0_4_ * auVar16._0_4_;
  fVar149 = auVar177._4_4_ * auVar16._4_4_;
  fVar150 = auVar177._8_4_ * auVar16._8_4_;
  fVar182 = auVar177._12_4_ * auVar16._12_4_;
  auVar93 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar195 = auVar93._0_4_;
  auVar177 = ZEXT416((uint)fVar195);
  auVar207 = vrsqrtss_avx(auVar177,auVar177);
  fVar196 = auVar207._0_4_;
  auVar207 = vshufps_avx(auVar73,auVar73,0xc9);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar348._0_4_ = auVar93._0_4_ * auVar207._0_4_;
  auVar348._4_4_ = auVar93._4_4_ * auVar207._4_4_;
  auVar348._8_4_ = auVar93._8_4_ * auVar207._8_4_;
  auVar348._12_4_ = auVar93._12_4_ * auVar207._12_4_;
  auVar93 = vdpps_avx(auVar15,auVar207,0x7f);
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar86._0_4_ = auVar93._0_4_ * auVar15._0_4_;
  auVar86._4_4_ = auVar93._4_4_ * auVar15._4_4_;
  auVar86._8_4_ = auVar93._8_4_ * auVar15._8_4_;
  auVar86._12_4_ = auVar93._12_4_ * auVar15._12_4_;
  auVar73 = vsubps_avx(auVar348,auVar86);
  auVar93 = vrcpss_avx(auVar177,auVar177);
  auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar195 * auVar93._0_4_)));
  auVar93 = vshufps_avx(auVar93,auVar93,0);
  auVar207 = ZEXT416((uint)(fVar196 * 1.5 - fVar195 * 0.5 * fVar196 * fVar196 * fVar196));
  auVar207 = vshufps_avx(auVar207,auVar207,0);
  fVar195 = auVar15._0_4_ * auVar207._0_4_;
  fVar196 = auVar15._4_4_ * auVar207._4_4_;
  fVar198 = auVar15._8_4_ * auVar207._8_4_;
  fVar201 = auVar15._12_4_ * auVar207._12_4_;
  auVar177 = vshufps_avx(auVar129,auVar129,0xff);
  auVar15 = vshufps_avx(_local_5f8,_local_5f8,0xff);
  auVar124._0_4_ = auVar15._0_4_ * fVar116;
  auVar124._4_4_ = auVar15._4_4_ * fVar149;
  auVar124._8_4_ = auVar15._8_4_ * fVar150;
  auVar124._12_4_ = auVar15._12_4_ * fVar182;
  auVar160._0_4_ =
       auVar177._0_4_ * fVar116 + auVar15._0_4_ * auVar16._0_4_ * auVar74._0_4_ * auVar214._0_4_;
  auVar160._4_4_ =
       auVar177._4_4_ * fVar149 + auVar15._4_4_ * auVar16._4_4_ * auVar74._4_4_ * auVar214._4_4_;
  auVar160._8_4_ =
       auVar177._8_4_ * fVar150 + auVar15._8_4_ * auVar16._8_4_ * auVar74._8_4_ * auVar214._8_4_;
  auVar160._12_4_ =
       auVar177._12_4_ * fVar182 +
       auVar15._12_4_ * auVar16._12_4_ * auVar74._12_4_ * auVar214._12_4_;
  auVar15 = vsubps_avx(_local_5f8,auVar124);
  local_5f8._0_4_ = (float)local_5f8._0_4_ + auVar124._0_4_;
  local_5f8._4_4_ = (float)local_5f8._4_4_ + auVar124._4_4_;
  fStack_5f0 = fStack_5f0 + auVar124._8_4_;
  fStack_5ec = fStack_5ec + auVar124._12_4_;
  auVar16 = vsubps_avx(auVar129,auVar160);
  auVar177 = vshufps_avx(auVar17,auVar17,0xff);
  auVar214 = vshufps_avx(auVar336,auVar336,0xff);
  auVar215._0_4_ = auVar214._0_4_ * fVar195;
  auVar215._4_4_ = auVar214._4_4_ * fVar196;
  auVar215._8_4_ = auVar214._8_4_ * fVar198;
  auVar215._12_4_ = auVar214._12_4_ * fVar201;
  auVar161._0_4_ =
       auVar177._0_4_ * fVar195 + auVar214._0_4_ * auVar207._0_4_ * auVar73._0_4_ * auVar93._0_4_;
  auVar161._4_4_ =
       auVar177._4_4_ * fVar196 + auVar214._4_4_ * auVar207._4_4_ * auVar73._4_4_ * auVar93._4_4_;
  auVar161._8_4_ =
       auVar177._8_4_ * fVar198 + auVar214._8_4_ * auVar207._8_4_ * auVar73._8_4_ * auVar93._8_4_;
  auVar161._12_4_ =
       auVar177._12_4_ * fVar201 +
       auVar214._12_4_ * auVar207._12_4_ * auVar73._12_4_ * auVar93._12_4_;
  auVar177 = vsubps_avx(auVar336,auVar215);
  auVar349._0_4_ = auVar336._0_4_ + auVar215._0_4_;
  auVar349._4_4_ = auVar336._4_4_ + auVar215._4_4_;
  auVar349._8_4_ = auVar336._8_4_ + auVar215._8_4_;
  auVar349._12_4_ = auVar336._12_4_ + auVar215._12_4_;
  auVar214 = vsubps_avx(auVar17,auVar161);
  local_538 = auVar139._0_4_;
  fStack_534 = auVar139._4_4_;
  fStack_530 = auVar139._8_4_;
  fStack_52c = auVar139._12_4_;
  local_468 = auVar267._0_4_;
  fStack_464 = auVar267._4_4_;
  fStack_460 = auVar267._8_4_;
  fStack_45c = auVar267._12_4_;
  auVar93 = vshufps_avx(ZEXT416((uint)fVar115),ZEXT416((uint)fVar115),0);
  auVar207 = vshufps_avx(ZEXT416((uint)(1.0 - fVar115)),ZEXT416((uint)(1.0 - fVar115)),0);
  fVar182 = auVar93._0_4_;
  fVar195 = auVar93._4_4_;
  fVar196 = auVar93._8_4_;
  fVar198 = auVar93._12_4_;
  fVar115 = auVar207._0_4_;
  fVar116 = auVar207._4_4_;
  fVar149 = auVar207._8_4_;
  fVar150 = auVar207._12_4_;
  local_3f8._0_4_ = fVar115 * local_468 + fVar182 * auVar15._0_4_;
  local_3f8._4_4_ = fVar116 * fStack_464 + fVar195 * auVar15._4_4_;
  fStack_3f0 = fVar149 * fStack_460 + fVar196 * auVar15._8_4_;
  fStack_3ec = fVar150 * fStack_45c + fVar198 * auVar15._12_4_;
  fVar234 = (local_468 + local_538 * 0.33333334) * fVar115 +
            (auVar15._0_4_ + auVar16._0_4_ * 0.33333334) * fVar182;
  fVar236 = (fStack_464 + fStack_534 * 0.33333334) * fVar116 +
            (auVar15._4_4_ + auVar16._4_4_ * 0.33333334) * fVar195;
  fVar254 = (fStack_460 + fStack_530 * 0.33333334) * fVar149 +
            (auVar15._8_4_ + auVar16._8_4_ * 0.33333334) * fVar196;
  fVar256 = (fStack_45c + fStack_52c * 0.33333334) * fVar150 +
            (auVar15._12_4_ + auVar16._12_4_ * 0.33333334) * fVar198;
  local_578 = auVar167._0_4_;
  fStack_574 = auVar167._4_4_;
  fStack_570 = auVar167._8_4_;
  fStack_56c = auVar167._12_4_;
  auVar242._0_4_ = local_578 * 0.33333334;
  auVar242._4_4_ = fStack_574 * 0.33333334;
  auVar242._8_4_ = fStack_570 * 0.33333334;
  auVar242._12_4_ = fStack_56c * 0.33333334;
  auVar93 = vsubps_avx(auVar128,auVar242);
  auVar290._0_4_ = (fVar279 + auVar82._0_4_) * 0.33333334;
  auVar290._4_4_ = (fVar280 + auVar82._4_4_) * 0.33333334;
  auVar290._8_4_ = (fVar297 + auVar82._8_4_) * 0.33333334;
  auVar290._12_4_ = (fVar298 + auVar82._12_4_) * 0.33333334;
  auVar207 = vsubps_avx(_local_5c8,auVar290);
  auVar216._0_4_ = auVar214._0_4_ * 0.33333334;
  auVar216._4_4_ = auVar214._4_4_ * 0.33333334;
  auVar216._8_4_ = auVar214._8_4_ * 0.33333334;
  auVar216._12_4_ = auVar214._12_4_ * 0.33333334;
  auVar214 = vsubps_avx(auVar177,auVar216);
  auVar162._0_4_ = (fVar237 + auVar161._0_4_) * 0.33333334;
  auVar162._4_4_ = (fVar253 + auVar161._4_4_) * 0.33333334;
  auVar162._8_4_ = (fVar255 + auVar161._8_4_) * 0.33333334;
  auVar162._12_4_ = (fVar197 + auVar161._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar349,auVar162);
  local_408._0_4_ = fVar115 * auVar93._0_4_ + fVar182 * auVar214._0_4_;
  local_408._4_4_ = fVar116 * auVar93._4_4_ + fVar195 * auVar214._4_4_;
  fStack_400 = fVar149 * auVar93._8_4_ + fVar196 * auVar214._8_4_;
  fStack_3fc = fVar150 * auVar93._12_4_ + fVar198 * auVar214._12_4_;
  fVar237 = fVar115 * auVar128._0_4_ + fVar182 * auVar177._0_4_;
  fVar253 = fVar116 * auVar128._4_4_ + fVar195 * auVar177._4_4_;
  fVar197 = fVar149 * auVar128._8_4_ + fVar196 * auVar177._8_4_;
  fVar202 = fVar150 * auVar128._12_4_ + fVar198 * auVar177._12_4_;
  local_418._0_4_ = (float)local_598._0_4_ * fVar115 + fVar182 * (float)local_5f8._0_4_;
  local_418._4_4_ = (float)local_598._4_4_ * fVar116 + fVar195 * (float)local_5f8._4_4_;
  fStack_410 = fStack_590 * fVar149 + fVar196 * fStack_5f0;
  fStack_40c = fStack_58c * fVar150 + fVar198 * fStack_5ec;
  local_428._0_4_ =
       ((float)local_598._0_4_ + (fVar113 + auVar208._0_4_) * 0.33333334) * fVar115 +
       ((fVar231 + auVar160._0_4_) * 0.33333334 + (float)local_5f8._0_4_) * fVar182;
  local_428._4_4_ =
       ((float)local_598._4_4_ + (fVar114 + auVar208._4_4_) * 0.33333334) * fVar116 +
       ((fVar233 + auVar160._4_4_) * 0.33333334 + (float)local_5f8._4_4_) * fVar195;
  fStack_420 = (fStack_590 + (fVar200 + auVar208._8_4_) * 0.33333334) * fVar149 +
               ((fVar235 + auVar160._8_4_) * 0.33333334 + fStack_5f0) * fVar196;
  fStack_41c = (fStack_58c + (fVar257 + auVar208._12_4_) * 0.33333334) * fVar150 +
               ((fVar252 + auVar160._12_4_) * 0.33333334 + fStack_5ec) * fVar198;
  fVar252 = auVar207._0_4_ * fVar115 + fVar182 * auVar15._0_4_;
  fVar255 = auVar207._4_4_ * fVar116 + fVar195 * auVar15._4_4_;
  fVar199 = auVar207._8_4_ * fVar149 + fVar196 * auVar15._8_4_;
  fVar232 = auVar207._12_4_ * fVar150 + fVar198 * auVar15._12_4_;
  local_308._0_4_ = (auVar261._0_4_ + auVar156._0_4_) * fVar115 + auVar349._0_4_ * fVar182;
  local_308._4_4_ = (auVar261._4_4_ + auVar156._4_4_) * fVar116 + auVar349._4_4_ * fVar195;
  fStack_300 = (auVar261._8_4_ + auVar156._8_4_) * fVar149 + auVar349._8_4_ * fVar196;
  fStack_2fc = (auVar261._12_4_ + auVar156._12_4_) * fVar150 + auVar349._12_4_ * fVar198;
  auVar93 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar93 = vinsertps_avx(auVar93,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_268 = vsubps_avx(_local_3f8,auVar93);
  auVar177 = vmovsldup_avx(local_268);
  auVar207 = vmovshdup_avx(local_268);
  auVar214 = vshufps_avx(local_268,local_268,0xaa);
  fVar115 = pre->ray_space[k].vx.field_0.m128[0];
  fVar116 = pre->ray_space[k].vx.field_0.m128[1];
  fVar149 = pre->ray_space[k].vx.field_0.m128[2];
  fVar150 = pre->ray_space[k].vx.field_0.m128[3];
  fVar182 = pre->ray_space[k].vy.field_0.m128[0];
  fVar195 = pre->ray_space[k].vy.field_0.m128[1];
  fVar196 = pre->ray_space[k].vy.field_0.m128[2];
  fVar198 = pre->ray_space[k].vy.field_0.m128[3];
  fVar201 = pre->ray_space[k].vz.field_0.m128[0];
  fVar231 = pre->ray_space[k].vz.field_0.m128[1];
  fVar233 = pre->ray_space[k].vz.field_0.m128[2];
  fVar235 = pre->ray_space[k].vz.field_0.m128[3];
  local_5e8._0_4_ = fVar115 * auVar177._0_4_ + fVar182 * auVar207._0_4_ + fVar201 * auVar214._0_4_;
  local_5e8._4_4_ = fVar116 * auVar177._4_4_ + fVar195 * auVar207._4_4_ + fVar231 * auVar214._4_4_;
  fStack_5e0 = fVar149 * auVar177._8_4_ + fVar196 * auVar207._8_4_ + fVar233 * auVar214._8_4_;
  fStack_5dc = fVar150 * auVar177._12_4_ + fVar198 * auVar207._12_4_ + fVar235 * auVar214._12_4_;
  auVar60._4_4_ = fVar236;
  auVar60._0_4_ = fVar234;
  auVar60._8_4_ = fVar254;
  auVar60._12_4_ = fVar256;
  local_278 = vsubps_avx(auVar60,auVar93);
  auVar214 = vshufps_avx(local_278,local_278,0xaa);
  auVar207 = vmovshdup_avx(local_278);
  auVar177 = vmovsldup_avx(local_278);
  auVar350._0_4_ = fVar115 * auVar177._0_4_ + fVar182 * auVar207._0_4_ + fVar201 * auVar214._0_4_;
  auVar350._4_4_ = fVar116 * auVar177._4_4_ + fVar195 * auVar207._4_4_ + fVar231 * auVar214._4_4_;
  auVar350._8_4_ = fVar149 * auVar177._8_4_ + fVar196 * auVar207._8_4_ + fVar233 * auVar214._8_4_;
  auVar350._12_4_ =
       fVar150 * auVar177._12_4_ + fVar198 * auVar207._12_4_ + fVar235 * auVar214._12_4_;
  local_288 = vsubps_avx(_local_408,auVar93);
  auVar214 = vshufps_avx(local_288,local_288,0xaa);
  auVar207 = vmovshdup_avx(local_288);
  auVar177 = vmovsldup_avx(local_288);
  auVar337._0_4_ = fVar115 * auVar177._0_4_ + fVar182 * auVar207._0_4_ + fVar201 * auVar214._0_4_;
  auVar337._4_4_ = fVar116 * auVar177._4_4_ + fVar195 * auVar207._4_4_ + fVar231 * auVar214._4_4_;
  auVar337._8_4_ = fVar149 * auVar177._8_4_ + fVar196 * auVar207._8_4_ + fVar233 * auVar214._8_4_;
  auVar337._12_4_ =
       fVar150 * auVar177._12_4_ + fVar198 * auVar207._12_4_ + fVar235 * auVar214._12_4_;
  auVar58._4_4_ = fVar253;
  auVar58._0_4_ = fVar237;
  auVar58._8_4_ = fVar197;
  auVar58._12_4_ = fVar202;
  local_298 = vsubps_avx(auVar58,auVar93);
  auVar214 = vshufps_avx(local_298,local_298,0xaa);
  auVar207 = vmovshdup_avx(local_298);
  auVar177 = vmovsldup_avx(local_298);
  auVar125._0_4_ = auVar177._0_4_ * fVar115 + auVar207._0_4_ * fVar182 + fVar201 * auVar214._0_4_;
  auVar125._4_4_ = auVar177._4_4_ * fVar116 + auVar207._4_4_ * fVar195 + fVar231 * auVar214._4_4_;
  auVar125._8_4_ = auVar177._8_4_ * fVar149 + auVar207._8_4_ * fVar196 + fVar233 * auVar214._8_4_;
  auVar125._12_4_ =
       auVar177._12_4_ * fVar150 + auVar207._12_4_ * fVar198 + fVar235 * auVar214._12_4_;
  local_2a8 = vsubps_avx(_local_418,auVar93);
  auVar214 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar207 = vmovshdup_avx(local_2a8);
  auVar177 = vmovsldup_avx(local_2a8);
  auVar291._0_4_ = auVar177._0_4_ * fVar115 + auVar207._0_4_ * fVar182 + auVar214._0_4_ * fVar201;
  auVar291._4_4_ = auVar177._4_4_ * fVar116 + auVar207._4_4_ * fVar195 + auVar214._4_4_ * fVar231;
  auVar291._8_4_ = auVar177._8_4_ * fVar149 + auVar207._8_4_ * fVar196 + auVar214._8_4_ * fVar233;
  auVar291._12_4_ =
       auVar177._12_4_ * fVar150 + auVar207._12_4_ * fVar198 + auVar214._12_4_ * fVar235;
  local_2b8 = vsubps_avx(_local_428,auVar93);
  auVar214 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar207 = vmovshdup_avx(local_2b8);
  auVar177 = vmovsldup_avx(local_2b8);
  auVar304._0_4_ = auVar177._0_4_ * fVar115 + auVar207._0_4_ * fVar182 + auVar214._0_4_ * fVar201;
  auVar304._4_4_ = auVar177._4_4_ * fVar116 + auVar207._4_4_ * fVar195 + auVar214._4_4_ * fVar231;
  auVar304._8_4_ = auVar177._8_4_ * fVar149 + auVar207._8_4_ * fVar196 + auVar214._8_4_ * fVar233;
  auVar304._12_4_ =
       auVar177._12_4_ * fVar150 + auVar207._12_4_ * fVar198 + auVar214._12_4_ * fVar235;
  auVar56._4_4_ = fVar255;
  auVar56._0_4_ = fVar252;
  auVar56._8_4_ = fVar199;
  auVar56._12_4_ = fVar232;
  local_2c8 = vsubps_avx(auVar56,auVar93);
  auVar214 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar207 = vmovshdup_avx(local_2c8);
  auVar177 = vmovsldup_avx(local_2c8);
  auVar320._0_4_ = auVar177._0_4_ * fVar115 + auVar207._0_4_ * fVar182 + auVar214._0_4_ * fVar201;
  auVar320._4_4_ = auVar177._4_4_ * fVar116 + auVar207._4_4_ * fVar195 + auVar214._4_4_ * fVar231;
  auVar320._8_4_ = auVar177._8_4_ * fVar149 + auVar207._8_4_ * fVar196 + auVar214._8_4_ * fVar233;
  auVar320._12_4_ =
       auVar177._12_4_ * fVar150 + auVar207._12_4_ * fVar198 + auVar214._12_4_ * fVar235;
  local_2d8 = vsubps_avx(_local_308,auVar93);
  auVar177 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar93 = vmovshdup_avx(local_2d8);
  auVar207 = vmovsldup_avx(local_2d8);
  auVar87._0_4_ = fVar115 * auVar207._0_4_ + fVar182 * auVar93._0_4_ + fVar201 * auVar177._0_4_;
  auVar87._4_4_ = fVar116 * auVar207._4_4_ + fVar195 * auVar93._4_4_ + fVar231 * auVar177._4_4_;
  auVar87._8_4_ = fVar149 * auVar207._8_4_ + fVar196 * auVar93._8_4_ + fVar233 * auVar177._8_4_;
  auVar87._12_4_ = fVar150 * auVar207._12_4_ + fVar198 * auVar93._12_4_ + fVar235 * auVar177._12_4_;
  auVar214 = vmovlhps_avx(_local_5e8,auVar291);
  auVar15 = vmovlhps_avx(auVar350,auVar304);
  auVar16 = vmovlhps_avx(auVar337,auVar320);
  _local_3d8 = vmovlhps_avx(auVar125,auVar87);
  auVar93 = vminps_avx(auVar214,auVar15);
  auVar207 = vminps_avx(auVar16,_local_3d8);
  auVar177 = vminps_avx(auVar93,auVar207);
  auVar93 = vmaxps_avx(auVar214,auVar15);
  auVar207 = vmaxps_avx(auVar16,_local_3d8);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  auVar207 = vshufpd_avx(auVar177,auVar177,3);
  auVar177 = vminps_avx(auVar177,auVar207);
  auVar207 = vshufpd_avx(auVar93,auVar93,3);
  auVar207 = vmaxps_avx(auVar93,auVar207);
  auVar262._8_4_ = 0x7fffffff;
  auVar262._0_8_ = 0x7fffffff7fffffff;
  auVar262._12_4_ = 0x7fffffff;
  auVar93 = vandps_avx(auVar177,auVar262);
  auVar207 = vandps_avx(auVar207,auVar262);
  auVar93 = vmaxps_avx(auVar93,auVar207);
  auVar207 = vmovshdup_avx(auVar93);
  auVar93 = vmaxss_avx(auVar207,auVar93);
  fVar115 = auVar93._0_4_ * 9.536743e-07;
  local_3e8 = ZEXT416((uint)fVar115);
  auVar93 = vshufps_avx(local_3e8,ZEXT416((uint)fVar115),0);
  local_78._16_16_ = auVar93;
  local_78._0_16_ = auVar93;
  auVar88._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
  auVar88._8_4_ = auVar93._8_4_ ^ 0x80000000;
  auVar88._12_4_ = auVar93._12_4_ ^ 0x80000000;
  local_228._16_16_ = auVar88;
  local_228._0_16_ = auVar88;
  local_318 = vpshufd_avx(ZEXT416(uVar64),0);
  local_328 = vpshufd_avx(ZEXT416(*(uint *)(local_430 + lVar66 * 4 + 6)),0);
  uVar65 = 0;
  uVar69 = 0;
  fVar115 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar15,auVar214);
  _local_248 = vsubps_avx(auVar16,auVar15);
  _local_258 = vsubps_avx(_local_3d8,auVar16);
  _local_338 = vsubps_avx(_local_418,_local_3f8);
  auVar61._4_4_ = fVar236;
  auVar61._0_4_ = fVar234;
  auVar61._8_4_ = fVar254;
  auVar61._12_4_ = fVar256;
  _local_348 = vsubps_avx(_local_428,auVar61);
  auVar57._4_4_ = fVar255;
  auVar57._0_4_ = fVar252;
  auVar57._8_4_ = fVar199;
  auVar57._12_4_ = fVar232;
  _local_358 = vsubps_avx(auVar57,_local_408);
  auVar59._4_4_ = fVar253;
  auVar59._0_4_ = fVar237;
  auVar59._8_4_ = fVar197;
  auVar59._12_4_ = fVar202;
  _local_368 = vsubps_avx(_local_308,auVar59);
  auVar89 = ZEXT816(0x3f80000000000000);
  local_2e8 = auVar89;
LAB_00f58926:
  do {
    auVar93 = vshufps_avx(auVar89,auVar89,0x50);
    auVar354._8_4_ = 0x3f800000;
    auVar354._0_8_ = 0x3f8000003f800000;
    auVar354._12_4_ = 0x3f800000;
    auVar358._16_4_ = 0x3f800000;
    auVar358._0_16_ = auVar354;
    auVar358._20_4_ = 0x3f800000;
    auVar358._24_4_ = 0x3f800000;
    auVar358._28_4_ = 0x3f800000;
    auVar207 = vsubps_avx(auVar354,auVar93);
    fVar116 = auVar93._0_4_;
    fVar149 = auVar93._4_4_;
    fVar150 = auVar93._8_4_;
    fVar182 = auVar93._12_4_;
    fVar195 = auVar207._0_4_;
    fVar196 = auVar207._4_4_;
    fVar198 = auVar207._8_4_;
    fVar201 = auVar207._12_4_;
    auVar191._0_4_ = auVar291._0_4_ * fVar116 + fVar195 * (float)local_5e8._0_4_;
    auVar191._4_4_ = auVar291._4_4_ * fVar149 + fVar196 * (float)local_5e8._4_4_;
    auVar191._8_4_ = auVar291._0_4_ * fVar150 + fVar198 * (float)local_5e8._0_4_;
    auVar191._12_4_ = auVar291._4_4_ * fVar182 + fVar201 * (float)local_5e8._4_4_;
    auVar163._0_4_ = auVar304._0_4_ * fVar116 + fVar195 * auVar350._0_4_;
    auVar163._4_4_ = auVar304._4_4_ * fVar149 + fVar196 * auVar350._4_4_;
    auVar163._8_4_ = auVar304._0_4_ * fVar150 + fVar198 * auVar350._0_4_;
    auVar163._12_4_ = auVar304._4_4_ * fVar182 + fVar201 * auVar350._4_4_;
    auVar276._0_4_ = auVar320._0_4_ * fVar116 + auVar337._0_4_ * fVar195;
    auVar276._4_4_ = auVar320._4_4_ * fVar149 + auVar337._4_4_ * fVar196;
    auVar276._8_4_ = auVar320._0_4_ * fVar150 + auVar337._0_4_ * fVar198;
    auVar276._12_4_ = auVar320._4_4_ * fVar182 + auVar337._4_4_ * fVar201;
    auVar217._0_4_ = auVar87._0_4_ * fVar116 + auVar125._0_4_ * fVar195;
    auVar217._4_4_ = auVar87._4_4_ * fVar149 + auVar125._4_4_ * fVar196;
    auVar217._8_4_ = auVar87._0_4_ * fVar150 + auVar125._0_4_ * fVar198;
    auVar217._12_4_ = auVar87._4_4_ * fVar182 + auVar125._4_4_ * fVar201;
    auVar93 = vmovshdup_avx(local_2e8);
    auVar207 = vshufps_avx(local_2e8,local_2e8,0);
    auVar310._16_16_ = auVar207;
    auVar310._0_16_ = auVar207;
    auVar177 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar106._16_16_ = auVar177;
    auVar106._0_16_ = auVar177;
    auVar105 = vsubps_avx(auVar106,auVar310);
    auVar177 = vshufps_avx(auVar191,auVar191,0);
    auVar139 = vshufps_avx(auVar191,auVar191,0x55);
    auVar128 = vshufps_avx(auVar163,auVar163,0);
    auVar167 = vshufps_avx(auVar163,auVar163,0x55);
    auVar129 = vshufps_avx(auVar276,auVar276,0);
    auVar267 = vshufps_avx(auVar276,auVar276,0x55);
    auVar17 = vshufps_avx(auVar217,auVar217,0);
    auVar73 = vshufps_avx(auVar217,auVar217,0x55);
    auVar93 = ZEXT416((uint)((auVar93._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar93 = vshufps_avx(auVar93,auVar93,0);
    auVar323._0_4_ = auVar207._0_4_ + auVar105._0_4_ * 0.0;
    auVar323._4_4_ = auVar207._4_4_ + auVar105._4_4_ * 0.14285715;
    auVar323._8_4_ = auVar207._8_4_ + auVar105._8_4_ * 0.2857143;
    auVar323._12_4_ = auVar207._12_4_ + auVar105._12_4_ * 0.42857146;
    auVar323._16_4_ = auVar207._0_4_ + auVar105._16_4_ * 0.5714286;
    auVar323._20_4_ = auVar207._4_4_ + auVar105._20_4_ * 0.71428573;
    auVar323._24_4_ = auVar207._8_4_ + auVar105._24_4_ * 0.8571429;
    auVar323._28_4_ = auVar207._12_4_ + auVar105._28_4_;
    auVar18 = vsubps_avx(auVar358,auVar323);
    fVar116 = auVar128._0_4_;
    fVar150 = auVar128._4_4_;
    fVar195 = auVar128._8_4_;
    fVar198 = auVar128._12_4_;
    fVar302 = auVar18._0_4_;
    fVar312 = auVar18._4_4_;
    fVar313 = auVar18._8_4_;
    fVar314 = auVar18._12_4_;
    fVar315 = auVar18._16_4_;
    fVar316 = auVar18._20_4_;
    fVar317 = auVar18._24_4_;
    fVar298 = auVar167._0_4_;
    fVar299 = auVar167._4_4_;
    fVar300 = auVar167._8_4_;
    fVar301 = auVar167._12_4_;
    fVar353 = auVar139._12_4_ + 1.0;
    fVar257 = auVar129._0_4_;
    fVar279 = auVar129._4_4_;
    fVar280 = auVar129._8_4_;
    fVar297 = auVar129._12_4_;
    fVar231 = fVar257 * auVar323._0_4_ + fVar302 * fVar116;
    fVar233 = fVar279 * auVar323._4_4_ + fVar312 * fVar150;
    fVar235 = fVar280 * auVar323._8_4_ + fVar313 * fVar195;
    fVar111 = fVar297 * auVar323._12_4_ + fVar314 * fVar198;
    fVar112 = fVar257 * auVar323._16_4_ + fVar315 * fVar116;
    fVar113 = fVar279 * auVar323._20_4_ + fVar316 * fVar150;
    fVar114 = fVar280 * auVar323._24_4_ + fVar317 * fVar195;
    fVar149 = auVar267._0_4_;
    fVar182 = auVar267._4_4_;
    fVar196 = auVar267._8_4_;
    fVar201 = auVar267._12_4_;
    fVar331 = fVar298 * fVar302 + auVar323._0_4_ * fVar149;
    fVar339 = fVar299 * fVar312 + auVar323._4_4_ * fVar182;
    fVar340 = fVar300 * fVar313 + auVar323._8_4_ * fVar196;
    fVar341 = fVar301 * fVar314 + auVar323._12_4_ * fVar201;
    fVar342 = fVar298 * fVar315 + auVar323._16_4_ * fVar149;
    fVar343 = fVar299 * fVar316 + auVar323._20_4_ * fVar182;
    fVar344 = fVar300 * fVar317 + auVar323._24_4_ * fVar196;
    fVar345 = fVar301 + fVar198;
    auVar207 = vshufps_avx(auVar191,auVar191,0xaa);
    auVar128 = vshufps_avx(auVar191,auVar191,0xff);
    fVar200 = fVar297 + 0.0;
    auVar167 = vshufps_avx(auVar163,auVar163,0xaa);
    auVar129 = vshufps_avx(auVar163,auVar163,0xff);
    auVar229._0_4_ =
         fVar302 * (auVar323._0_4_ * fVar116 + fVar302 * auVar177._0_4_) + auVar323._0_4_ * fVar231;
    auVar229._4_4_ =
         fVar312 * (auVar323._4_4_ * fVar150 + fVar312 * auVar177._4_4_) + auVar323._4_4_ * fVar233;
    auVar229._8_4_ =
         fVar313 * (auVar323._8_4_ * fVar195 + fVar313 * auVar177._8_4_) + auVar323._8_4_ * fVar235;
    auVar229._12_4_ =
         fVar314 * (auVar323._12_4_ * fVar198 + fVar314 * auVar177._12_4_) +
         auVar323._12_4_ * fVar111;
    auVar229._16_4_ =
         fVar315 * (auVar323._16_4_ * fVar116 + fVar315 * auVar177._0_4_) +
         auVar323._16_4_ * fVar112;
    auVar229._20_4_ =
         fVar316 * (auVar323._20_4_ * fVar150 + fVar316 * auVar177._4_4_) +
         auVar323._20_4_ * fVar113;
    auVar229._24_4_ =
         fVar317 * (auVar323._24_4_ * fVar195 + fVar317 * auVar177._8_4_) +
         auVar323._24_4_ * fVar114;
    auVar229._28_4_ = auVar177._12_4_ + 1.0 + fVar201;
    auVar250._0_4_ =
         fVar302 * (fVar298 * auVar323._0_4_ + auVar139._0_4_ * fVar302) + auVar323._0_4_ * fVar331;
    auVar250._4_4_ =
         fVar312 * (fVar299 * auVar323._4_4_ + auVar139._4_4_ * fVar312) + auVar323._4_4_ * fVar339;
    auVar250._8_4_ =
         fVar313 * (fVar300 * auVar323._8_4_ + auVar139._8_4_ * fVar313) + auVar323._8_4_ * fVar340;
    auVar250._12_4_ =
         fVar314 * (fVar301 * auVar323._12_4_ + auVar139._12_4_ * fVar314) +
         auVar323._12_4_ * fVar341;
    auVar250._16_4_ =
         fVar315 * (fVar298 * auVar323._16_4_ + auVar139._0_4_ * fVar315) +
         auVar323._16_4_ * fVar342;
    auVar250._20_4_ =
         fVar316 * (fVar299 * auVar323._20_4_ + auVar139._4_4_ * fVar316) +
         auVar323._20_4_ * fVar343;
    auVar250._24_4_ =
         fVar317 * (fVar300 * auVar323._24_4_ + auVar139._8_4_ * fVar317) +
         auVar323._24_4_ * fVar344;
    auVar250._28_4_ = auVar73._12_4_ + fVar201;
    auVar107._0_4_ =
         fVar302 * fVar231 + auVar323._0_4_ * (fVar257 * fVar302 + auVar17._0_4_ * auVar323._0_4_);
    auVar107._4_4_ =
         fVar312 * fVar233 + auVar323._4_4_ * (fVar279 * fVar312 + auVar17._4_4_ * auVar323._4_4_);
    auVar107._8_4_ =
         fVar313 * fVar235 + auVar323._8_4_ * (fVar280 * fVar313 + auVar17._8_4_ * auVar323._8_4_);
    auVar107._12_4_ =
         fVar314 * fVar111 +
         auVar323._12_4_ * (fVar297 * fVar314 + auVar17._12_4_ * auVar323._12_4_);
    auVar107._16_4_ =
         fVar315 * fVar112 + auVar323._16_4_ * (fVar257 * fVar315 + auVar17._0_4_ * auVar323._16_4_)
    ;
    auVar107._20_4_ =
         fVar316 * fVar113 + auVar323._20_4_ * (fVar279 * fVar316 + auVar17._4_4_ * auVar323._20_4_)
    ;
    auVar107._24_4_ =
         fVar317 * fVar114 + auVar323._24_4_ * (fVar280 * fVar317 + auVar17._8_4_ * auVar323._24_4_)
    ;
    auVar107._28_4_ = fVar198 + 1.0 + fVar200;
    auVar330._0_4_ =
         fVar302 * fVar331 + auVar323._0_4_ * (auVar73._0_4_ * auVar323._0_4_ + fVar302 * fVar149);
    auVar330._4_4_ =
         fVar312 * fVar339 + auVar323._4_4_ * (auVar73._4_4_ * auVar323._4_4_ + fVar312 * fVar182);
    auVar330._8_4_ =
         fVar313 * fVar340 + auVar323._8_4_ * (auVar73._8_4_ * auVar323._8_4_ + fVar313 * fVar196);
    auVar330._12_4_ =
         fVar314 * fVar341 +
         auVar323._12_4_ * (auVar73._12_4_ * auVar323._12_4_ + fVar314 * fVar201);
    auVar330._16_4_ =
         fVar315 * fVar342 + auVar323._16_4_ * (auVar73._0_4_ * auVar323._16_4_ + fVar315 * fVar149)
    ;
    auVar330._20_4_ =
         fVar316 * fVar343 + auVar323._20_4_ * (auVar73._4_4_ * auVar323._20_4_ + fVar316 * fVar182)
    ;
    auVar330._24_4_ =
         fVar317 * fVar344 + auVar323._24_4_ * (auVar73._8_4_ * auVar323._24_4_ + fVar317 * fVar196)
    ;
    auVar330._28_4_ = fVar200 + fVar201 + 0.0;
    local_98._0_4_ = fVar302 * auVar229._0_4_ + auVar323._0_4_ * auVar107._0_4_;
    local_98._4_4_ = fVar312 * auVar229._4_4_ + auVar323._4_4_ * auVar107._4_4_;
    local_98._8_4_ = fVar313 * auVar229._8_4_ + auVar323._8_4_ * auVar107._8_4_;
    local_98._12_4_ = fVar314 * auVar229._12_4_ + auVar323._12_4_ * auVar107._12_4_;
    local_98._16_4_ = fVar315 * auVar229._16_4_ + auVar323._16_4_ * auVar107._16_4_;
    local_98._20_4_ = fVar316 * auVar229._20_4_ + auVar323._20_4_ * auVar107._20_4_;
    local_98._24_4_ = fVar317 * auVar229._24_4_ + auVar323._24_4_ * auVar107._24_4_;
    local_98._28_4_ = fVar345 + fVar201 + 0.0;
    auVar194._0_4_ = fVar302 * auVar250._0_4_ + auVar323._0_4_ * auVar330._0_4_;
    auVar194._4_4_ = fVar312 * auVar250._4_4_ + auVar323._4_4_ * auVar330._4_4_;
    auVar194._8_4_ = fVar313 * auVar250._8_4_ + auVar323._8_4_ * auVar330._8_4_;
    auVar194._12_4_ = fVar314 * auVar250._12_4_ + auVar323._12_4_ * auVar330._12_4_;
    auVar194._16_4_ = fVar315 * auVar250._16_4_ + auVar323._16_4_ * auVar330._16_4_;
    auVar194._20_4_ = fVar316 * auVar250._20_4_ + auVar323._20_4_ * auVar330._20_4_;
    auVar194._24_4_ = fVar317 * auVar250._24_4_ + auVar323._24_4_ * auVar330._24_4_;
    auVar194._28_4_ = fVar345 + fVar200;
    auVar19 = vsubps_avx(auVar107,auVar229);
    auVar105 = vsubps_avx(auVar330,auVar250);
    local_538 = auVar93._0_4_;
    fStack_534 = auVar93._4_4_;
    fStack_530 = auVar93._8_4_;
    fStack_52c = auVar93._12_4_;
    local_d8 = local_538 * auVar19._0_4_ * 3.0;
    fStack_d4 = fStack_534 * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_d4;
    auVar20._0_4_ = local_d8;
    fStack_d0 = fStack_530 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_d0;
    fStack_cc = fStack_52c * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_cc;
    fStack_c8 = local_538 * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_c8;
    fStack_c4 = fStack_534 * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_c4;
    fStack_c0 = fStack_530 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_c0;
    auVar20._28_4_ = auVar19._28_4_;
    local_f8 = local_538 * auVar105._0_4_ * 3.0;
    fStack_f4 = fStack_534 * auVar105._4_4_ * 3.0;
    auVar21._4_4_ = fStack_f4;
    auVar21._0_4_ = local_f8;
    fStack_f0 = fStack_530 * auVar105._8_4_ * 3.0;
    auVar21._8_4_ = fStack_f0;
    fStack_ec = fStack_52c * auVar105._12_4_ * 3.0;
    auVar21._12_4_ = fStack_ec;
    fStack_e8 = local_538 * auVar105._16_4_ * 3.0;
    auVar21._16_4_ = fStack_e8;
    fStack_e4 = fStack_534 * auVar105._20_4_ * 3.0;
    auVar21._20_4_ = fStack_e4;
    fStack_e0 = fStack_530 * auVar105._24_4_ * 3.0;
    auVar21._24_4_ = fStack_e0;
    auVar21._28_4_ = fVar345;
    auVar20 = vsubps_avx(local_98,auVar20);
    auVar105 = vperm2f128_avx(auVar20,auVar20,1);
    auVar105 = vshufps_avx(auVar105,auVar20,0x30);
    auVar105 = vshufps_avx(auVar20,auVar105,0x29);
    auVar21 = vsubps_avx(auVar194,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar20,0x29);
    fVar343 = auVar167._0_4_;
    fVar344 = auVar167._4_4_;
    fVar360 = auVar167._8_4_;
    fVar198 = auVar207._12_4_;
    fVar279 = auVar129._0_4_;
    fVar297 = auVar129._4_4_;
    fVar331 = auVar129._8_4_;
    fVar339 = auVar129._12_4_;
    auVar93 = vshufps_avx(auVar276,auVar276,0xaa);
    fVar116 = auVar93._0_4_;
    fVar150 = auVar93._4_4_;
    fVar195 = auVar93._8_4_;
    fVar201 = auVar93._12_4_;
    fVar235 = auVar323._0_4_ * fVar116 + fVar343 * fVar302;
    fVar111 = auVar323._4_4_ * fVar150 + fVar344 * fVar312;
    fVar112 = auVar323._8_4_ * fVar195 + fVar360 * fVar313;
    fVar113 = auVar323._12_4_ * fVar201 + auVar167._12_4_ * fVar314;
    fVar114 = auVar323._16_4_ * fVar116 + fVar343 * fVar315;
    fVar200 = auVar323._20_4_ * fVar150 + fVar344 * fVar316;
    fVar257 = auVar323._24_4_ * fVar195 + fVar360 * fVar317;
    auVar93 = vshufps_avx(auVar276,auVar276,0xff);
    fVar149 = auVar93._0_4_;
    fVar182 = auVar93._4_4_;
    fVar196 = auVar93._8_4_;
    fVar231 = auVar93._12_4_;
    fVar280 = auVar323._0_4_ * fVar149 + fVar279 * fVar302;
    fVar298 = auVar323._4_4_ * fVar182 + fVar297 * fVar312;
    fVar299 = auVar323._8_4_ * fVar196 + fVar331 * fVar313;
    fVar300 = auVar323._12_4_ * fVar231 + fVar339 * fVar314;
    fVar340 = auVar323._16_4_ * fVar149 + fVar279 * fVar315;
    fVar301 = auVar323._20_4_ * fVar182 + fVar297 * fVar316;
    fVar341 = auVar323._24_4_ * fVar196 + fVar331 * fVar317;
    auVar93 = vshufps_avx(auVar217,auVar217,0xaa);
    fVar342 = auVar93._12_4_ + fVar201;
    auVar177 = vshufps_avx(auVar217,auVar217,0xff);
    fVar233 = auVar177._12_4_;
    auVar108._0_4_ =
         fVar302 * (fVar343 * auVar323._0_4_ + fVar302 * auVar207._0_4_) + auVar323._0_4_ * fVar235;
    auVar108._4_4_ =
         fVar312 * (fVar344 * auVar323._4_4_ + fVar312 * auVar207._4_4_) + auVar323._4_4_ * fVar111;
    auVar108._8_4_ =
         fVar313 * (fVar360 * auVar323._8_4_ + fVar313 * auVar207._8_4_) + auVar323._8_4_ * fVar112;
    auVar108._12_4_ =
         fVar314 * (auVar167._12_4_ * auVar323._12_4_ + fVar314 * fVar198) +
         auVar323._12_4_ * fVar113;
    auVar108._16_4_ =
         fVar315 * (fVar343 * auVar323._16_4_ + fVar315 * auVar207._0_4_) +
         auVar323._16_4_ * fVar114;
    auVar108._20_4_ =
         fVar316 * (fVar344 * auVar323._20_4_ + fVar316 * auVar207._4_4_) +
         auVar323._20_4_ * fVar200;
    auVar108._24_4_ =
         fVar317 * (fVar360 * auVar323._24_4_ + fVar317 * auVar207._8_4_) +
         auVar323._24_4_ * fVar257;
    auVar108._28_4_ = auVar21._28_4_ + fVar198 + fVar233;
    auVar145._0_4_ =
         fVar302 * (fVar279 * auVar323._0_4_ + auVar128._0_4_ * fVar302) + auVar323._0_4_ * fVar280;
    auVar145._4_4_ =
         fVar312 * (fVar297 * auVar323._4_4_ + auVar128._4_4_ * fVar312) + auVar323._4_4_ * fVar298;
    auVar145._8_4_ =
         fVar313 * (fVar331 * auVar323._8_4_ + auVar128._8_4_ * fVar313) + auVar323._8_4_ * fVar299;
    auVar145._12_4_ =
         fVar314 * (fVar339 * auVar323._12_4_ + auVar128._12_4_ * fVar314) +
         auVar323._12_4_ * fVar300;
    auVar145._16_4_ =
         fVar315 * (fVar279 * auVar323._16_4_ + auVar128._0_4_ * fVar315) +
         auVar323._16_4_ * fVar340;
    auVar145._20_4_ =
         fVar316 * (fVar297 * auVar323._20_4_ + auVar128._4_4_ * fVar316) +
         auVar323._20_4_ * fVar301;
    auVar145._24_4_ =
         fVar317 * (fVar331 * auVar323._24_4_ + auVar128._8_4_ * fVar317) +
         auVar323._24_4_ * fVar341;
    auVar145._28_4_ = fVar198 + auVar20._28_4_ + fVar233;
    auVar20 = vperm2f128_avx(local_98,local_98,1);
    auVar20 = vshufps_avx(auVar20,local_98,0x30);
    auVar106 = vshufps_avx(local_98,auVar20,0x29);
    auVar251._0_4_ =
         auVar323._0_4_ * (auVar93._0_4_ * auVar323._0_4_ + fVar302 * fVar116) + fVar302 * fVar235;
    auVar251._4_4_ =
         auVar323._4_4_ * (auVar93._4_4_ * auVar323._4_4_ + fVar312 * fVar150) + fVar312 * fVar111;
    auVar251._8_4_ =
         auVar323._8_4_ * (auVar93._8_4_ * auVar323._8_4_ + fVar313 * fVar195) + fVar313 * fVar112;
    auVar251._12_4_ =
         auVar323._12_4_ * (auVar93._12_4_ * auVar323._12_4_ + fVar314 * fVar201) +
         fVar314 * fVar113;
    auVar251._16_4_ =
         auVar323._16_4_ * (auVar93._0_4_ * auVar323._16_4_ + fVar315 * fVar116) + fVar315 * fVar114
    ;
    auVar251._20_4_ =
         auVar323._20_4_ * (auVar93._4_4_ * auVar323._20_4_ + fVar316 * fVar150) + fVar316 * fVar200
    ;
    auVar251._24_4_ =
         auVar323._24_4_ * (auVar93._8_4_ * auVar323._24_4_ + fVar317 * fVar195) + fVar317 * fVar257
    ;
    auVar251._28_4_ = fVar342 + fVar353 + auVar250._28_4_;
    auVar296._0_4_ =
         fVar302 * fVar280 + auVar323._0_4_ * (auVar323._0_4_ * auVar177._0_4_ + fVar302 * fVar149);
    auVar296._4_4_ =
         fVar312 * fVar298 + auVar323._4_4_ * (auVar323._4_4_ * auVar177._4_4_ + fVar312 * fVar182);
    auVar296._8_4_ =
         fVar313 * fVar299 + auVar323._8_4_ * (auVar323._8_4_ * auVar177._8_4_ + fVar313 * fVar196);
    auVar296._12_4_ =
         fVar314 * fVar300 + auVar323._12_4_ * (auVar323._12_4_ * fVar233 + fVar314 * fVar231);
    auVar296._16_4_ =
         fVar315 * fVar340 +
         auVar323._16_4_ * (auVar323._16_4_ * auVar177._0_4_ + fVar315 * fVar149);
    auVar296._20_4_ =
         fVar316 * fVar301 +
         auVar323._20_4_ * (auVar323._20_4_ * auVar177._4_4_ + fVar316 * fVar182);
    auVar296._24_4_ =
         fVar317 * fVar341 +
         auVar323._24_4_ * (auVar323._24_4_ * auVar177._8_4_ + fVar317 * fVar196);
    auVar296._28_4_ = fVar353 + fVar339 + fVar233 + fVar231;
    auVar278._0_4_ = fVar302 * auVar108._0_4_ + auVar323._0_4_ * auVar251._0_4_;
    auVar278._4_4_ = fVar312 * auVar108._4_4_ + auVar323._4_4_ * auVar251._4_4_;
    auVar278._8_4_ = fVar313 * auVar108._8_4_ + auVar323._8_4_ * auVar251._8_4_;
    auVar278._12_4_ = fVar314 * auVar108._12_4_ + auVar323._12_4_ * auVar251._12_4_;
    auVar278._16_4_ = fVar315 * auVar108._16_4_ + auVar323._16_4_ * auVar251._16_4_;
    auVar278._20_4_ = fVar316 * auVar108._20_4_ + auVar323._20_4_ * auVar251._20_4_;
    auVar278._24_4_ = fVar317 * auVar108._24_4_ + auVar323._24_4_ * auVar251._24_4_;
    auVar278._28_4_ = fVar342 + fVar233 + fVar231;
    auVar311._0_4_ = fVar302 * auVar145._0_4_ + auVar323._0_4_ * auVar296._0_4_;
    auVar311._4_4_ = fVar312 * auVar145._4_4_ + auVar323._4_4_ * auVar296._4_4_;
    auVar311._8_4_ = fVar313 * auVar145._8_4_ + auVar323._8_4_ * auVar296._8_4_;
    auVar311._12_4_ = fVar314 * auVar145._12_4_ + auVar323._12_4_ * auVar296._12_4_;
    auVar311._16_4_ = fVar315 * auVar145._16_4_ + auVar323._16_4_ * auVar296._16_4_;
    auVar311._20_4_ = fVar316 * auVar145._20_4_ + auVar323._20_4_ * auVar296._20_4_;
    auVar311._24_4_ = fVar317 * auVar145._24_4_ + auVar323._24_4_ * auVar296._24_4_;
    auVar311._28_4_ = auVar18._28_4_ + auVar323._28_4_;
    auVar22 = vsubps_avx(auVar251,auVar108);
    auVar20 = vsubps_avx(auVar296,auVar145);
    local_118 = local_538 * auVar22._0_4_ * 3.0;
    fStack_114 = fStack_534 * auVar22._4_4_ * 3.0;
    auVar18._4_4_ = fStack_114;
    auVar18._0_4_ = local_118;
    fStack_110 = fStack_530 * auVar22._8_4_ * 3.0;
    auVar18._8_4_ = fStack_110;
    fStack_10c = fStack_52c * auVar22._12_4_ * 3.0;
    auVar18._12_4_ = fStack_10c;
    fStack_108 = local_538 * auVar22._16_4_ * 3.0;
    auVar18._16_4_ = fStack_108;
    fStack_104 = fStack_534 * auVar22._20_4_ * 3.0;
    auVar18._20_4_ = fStack_104;
    fStack_100 = fStack_530 * auVar22._24_4_ * 3.0;
    auVar18._24_4_ = fStack_100;
    auVar18._28_4_ = auVar22._28_4_;
    local_138 = local_538 * auVar20._0_4_ * 3.0;
    fStack_134 = fStack_534 * auVar20._4_4_ * 3.0;
    auVar23._4_4_ = fStack_134;
    auVar23._0_4_ = local_138;
    fStack_130 = fStack_530 * auVar20._8_4_ * 3.0;
    auVar23._8_4_ = fStack_130;
    fStack_12c = fStack_52c * auVar20._12_4_ * 3.0;
    auVar23._12_4_ = fStack_12c;
    fStack_128 = local_538 * auVar20._16_4_ * 3.0;
    auVar23._16_4_ = fStack_128;
    fStack_124 = fStack_534 * auVar20._20_4_ * 3.0;
    auVar23._20_4_ = fStack_124;
    fStack_120 = fStack_530 * auVar20._24_4_ * 3.0;
    auVar23._24_4_ = fStack_120;
    auVar23._28_4_ = auVar251._28_4_;
    auVar20 = vperm2f128_avx(auVar278,auVar278,1);
    auVar20 = vshufps_avx(auVar20,auVar278,0x30);
    auVar107 = vshufps_avx(auVar278,auVar20,0x29);
    auVar18 = vsubps_avx(auVar278,auVar18);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar20 = vshufps_avx(auVar18,auVar20,0x29);
    auVar23 = vsubps_avx(auVar311,auVar23);
    auVar18 = vperm2f128_avx(auVar23,auVar23,1);
    auVar18 = vshufps_avx(auVar18,auVar23,0x30);
    auVar23 = vshufps_avx(auVar23,auVar18,0x29);
    auVar24 = vsubps_avx(auVar278,local_98);
    auVar108 = vsubps_avx(auVar107,auVar106);
    fVar116 = auVar108._0_4_ + auVar24._0_4_;
    fVar149 = auVar108._4_4_ + auVar24._4_4_;
    fVar150 = auVar108._8_4_ + auVar24._8_4_;
    fVar182 = auVar108._12_4_ + auVar24._12_4_;
    fVar195 = auVar108._16_4_ + auVar24._16_4_;
    fVar196 = auVar108._20_4_ + auVar24._20_4_;
    fVar198 = auVar108._24_4_ + auVar24._24_4_;
    auVar18 = vperm2f128_avx(auVar194,auVar194,1);
    auVar18 = vshufps_avx(auVar18,auVar194,0x30);
    local_b8 = vshufps_avx(auVar194,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar311,auVar311,1);
    auVar18 = vshufps_avx(auVar18,auVar311,0x30);
    local_388 = vshufps_avx(auVar311,auVar18,0x29);
    auVar18 = vsubps_avx(auVar311,auVar194);
    auVar145 = vsubps_avx(local_388,local_b8);
    fVar201 = auVar145._0_4_ + auVar18._0_4_;
    fVar231 = auVar145._4_4_ + auVar18._4_4_;
    fVar233 = auVar145._8_4_ + auVar18._8_4_;
    fVar235 = auVar145._12_4_ + auVar18._12_4_;
    fVar111 = auVar145._16_4_ + auVar18._16_4_;
    fVar112 = auVar145._20_4_ + auVar18._20_4_;
    fVar113 = auVar145._24_4_ + auVar18._24_4_;
    auVar25._4_4_ = fVar149 * auVar194._4_4_;
    auVar25._0_4_ = fVar116 * auVar194._0_4_;
    auVar25._8_4_ = fVar150 * auVar194._8_4_;
    auVar25._12_4_ = fVar182 * auVar194._12_4_;
    auVar25._16_4_ = fVar195 * auVar194._16_4_;
    auVar25._20_4_ = fVar196 * auVar194._20_4_;
    auVar25._24_4_ = fVar198 * auVar194._24_4_;
    auVar25._28_4_ = auVar18._28_4_;
    auVar26._4_4_ = fVar231 * local_98._4_4_;
    auVar26._0_4_ = fVar201 * local_98._0_4_;
    auVar26._8_4_ = fVar233 * local_98._8_4_;
    auVar26._12_4_ = fVar235 * local_98._12_4_;
    auVar26._16_4_ = fVar111 * local_98._16_4_;
    auVar26._20_4_ = fVar112 * local_98._20_4_;
    auVar26._24_4_ = fVar113 * local_98._24_4_;
    auVar26._28_4_ = fVar342;
    auVar25 = vsubps_avx(auVar25,auVar26);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar19._28_4_;
    local_f8 = local_f8 + auVar194._0_4_;
    fStack_f4 = fStack_f4 + auVar194._4_4_;
    fStack_f0 = fStack_f0 + auVar194._8_4_;
    fStack_ec = fStack_ec + auVar194._12_4_;
    fStack_e8 = fStack_e8 + auVar194._16_4_;
    fStack_e4 = fStack_e4 + auVar194._20_4_;
    fStack_e0 = fStack_e0 + auVar194._24_4_;
    fStack_dc = fVar345 + auVar194._28_4_;
    auVar19._4_4_ = fVar149 * fStack_f4;
    auVar19._0_4_ = fVar116 * local_f8;
    auVar19._8_4_ = fVar150 * fStack_f0;
    auVar19._12_4_ = fVar182 * fStack_ec;
    auVar19._16_4_ = fVar195 * fStack_e8;
    auVar19._20_4_ = fVar196 * fStack_e4;
    auVar19._24_4_ = fVar198 * fStack_e0;
    auVar19._28_4_ = fVar345;
    auVar27._4_4_ = fVar231 * fStack_d4;
    auVar27._0_4_ = fVar201 * local_d8;
    auVar27._8_4_ = fVar233 * fStack_d0;
    auVar27._12_4_ = fVar235 * fStack_cc;
    auVar27._16_4_ = fVar111 * fStack_c8;
    auVar27._20_4_ = fVar112 * fStack_c4;
    auVar27._24_4_ = fVar113 * fStack_c0;
    auVar27._28_4_ = fVar345 + auVar194._28_4_;
    auVar19 = vsubps_avx(auVar19,auVar27);
    local_518 = auVar21._0_4_;
    fStack_514 = auVar21._4_4_;
    fStack_510 = auVar21._8_4_;
    fStack_50c = auVar21._12_4_;
    fStack_508 = auVar21._16_4_;
    fStack_504 = auVar21._20_4_;
    fStack_500 = auVar21._24_4_;
    auVar28._4_4_ = fVar149 * fStack_514;
    auVar28._0_4_ = fVar116 * local_518;
    auVar28._8_4_ = fVar150 * fStack_510;
    auVar28._12_4_ = fVar182 * fStack_50c;
    auVar28._16_4_ = fVar195 * fStack_508;
    auVar28._20_4_ = fVar196 * fStack_504;
    auVar28._24_4_ = fVar198 * fStack_500;
    auVar28._28_4_ = fVar345;
    local_598._0_4_ = auVar105._0_4_;
    local_598._4_4_ = auVar105._4_4_;
    fStack_590 = auVar105._8_4_;
    fStack_58c = auVar105._12_4_;
    fStack_588 = auVar105._16_4_;
    fStack_584 = auVar105._20_4_;
    fStack_580 = auVar105._24_4_;
    auVar29._4_4_ = fVar231 * (float)local_598._4_4_;
    auVar29._0_4_ = fVar201 * (float)local_598._0_4_;
    auVar29._8_4_ = fVar233 * fStack_590;
    auVar29._12_4_ = fVar235 * fStack_58c;
    auVar29._16_4_ = fVar111 * fStack_588;
    auVar29._20_4_ = fVar112 * fStack_584;
    auVar29._24_4_ = fVar113 * fStack_580;
    auVar29._28_4_ = local_98._28_4_;
    auVar26 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = local_b8._4_4_ * fVar149;
    auVar30._0_4_ = local_b8._0_4_ * fVar116;
    auVar30._8_4_ = local_b8._8_4_ * fVar150;
    auVar30._12_4_ = local_b8._12_4_ * fVar182;
    auVar30._16_4_ = local_b8._16_4_ * fVar195;
    auVar30._20_4_ = local_b8._20_4_ * fVar196;
    auVar30._24_4_ = local_b8._24_4_ * fVar198;
    auVar30._28_4_ = fVar345;
    auVar31._4_4_ = auVar106._4_4_ * fVar231;
    auVar31._0_4_ = auVar106._0_4_ * fVar201;
    auVar31._8_4_ = auVar106._8_4_ * fVar233;
    auVar31._12_4_ = auVar106._12_4_ * fVar235;
    auVar31._16_4_ = auVar106._16_4_ * fVar111;
    auVar31._20_4_ = auVar106._20_4_ * fVar112;
    auVar31._24_4_ = auVar106._24_4_ * fVar113;
    auVar31._28_4_ = local_b8._28_4_;
    local_538 = auVar20._0_4_;
    fStack_534 = auVar20._4_4_;
    fStack_530 = auVar20._8_4_;
    fStack_52c = auVar20._12_4_;
    fStack_528 = auVar20._16_4_;
    fStack_524 = auVar20._20_4_;
    fStack_520 = auVar20._24_4_;
    auVar27 = vsubps_avx(auVar30,auVar31);
    auVar32._4_4_ = auVar311._4_4_ * fVar149;
    auVar32._0_4_ = auVar311._0_4_ * fVar116;
    auVar32._8_4_ = auVar311._8_4_ * fVar150;
    auVar32._12_4_ = auVar311._12_4_ * fVar182;
    auVar32._16_4_ = auVar311._16_4_ * fVar195;
    auVar32._20_4_ = auVar311._20_4_ * fVar196;
    auVar32._24_4_ = auVar311._24_4_ * fVar198;
    auVar32._28_4_ = fVar345;
    auVar33._4_4_ = fVar231 * auVar278._4_4_;
    auVar33._0_4_ = fVar201 * auVar278._0_4_;
    auVar33._8_4_ = fVar233 * auVar278._8_4_;
    auVar33._12_4_ = fVar235 * auVar278._12_4_;
    auVar33._16_4_ = fVar111 * auVar278._16_4_;
    auVar33._20_4_ = fVar112 * auVar278._20_4_;
    auVar33._24_4_ = fVar113 * auVar278._24_4_;
    auVar33._28_4_ = fStack_bc;
    auVar28 = vsubps_avx(auVar32,auVar33);
    local_118 = auVar278._0_4_ + local_118;
    fStack_114 = auVar278._4_4_ + fStack_114;
    fStack_110 = auVar278._8_4_ + fStack_110;
    fStack_10c = auVar278._12_4_ + fStack_10c;
    fStack_108 = auVar278._16_4_ + fStack_108;
    fStack_104 = auVar278._20_4_ + fStack_104;
    fStack_100 = auVar278._24_4_ + fStack_100;
    fStack_fc = auVar278._28_4_ + auVar22._28_4_;
    local_138 = auVar311._0_4_ + local_138;
    fStack_134 = auVar311._4_4_ + fStack_134;
    fStack_130 = auVar311._8_4_ + fStack_130;
    fStack_12c = auVar311._12_4_ + fStack_12c;
    fStack_128 = auVar311._16_4_ + fStack_128;
    fStack_124 = auVar311._20_4_ + fStack_124;
    fStack_120 = auVar311._24_4_ + fStack_120;
    fStack_11c = auVar311._28_4_ + auVar251._28_4_;
    auVar22._4_4_ = fVar149 * fStack_134;
    auVar22._0_4_ = fVar116 * local_138;
    auVar22._8_4_ = fVar150 * fStack_130;
    auVar22._12_4_ = fVar182 * fStack_12c;
    auVar22._16_4_ = fVar195 * fStack_128;
    auVar22._20_4_ = fVar196 * fStack_124;
    auVar22._24_4_ = fVar198 * fStack_120;
    auVar22._28_4_ = auVar311._28_4_ + auVar251._28_4_;
    auVar34._4_4_ = fStack_114 * fVar231;
    auVar34._0_4_ = local_118 * fVar201;
    auVar34._8_4_ = fStack_110 * fVar233;
    auVar34._12_4_ = fStack_10c * fVar235;
    auVar34._16_4_ = fStack_108 * fVar111;
    auVar34._20_4_ = fStack_104 * fVar112;
    auVar34._24_4_ = fStack_100 * fVar113;
    auVar34._28_4_ = fStack_fc;
    auVar22 = vsubps_avx(auVar22,auVar34);
    auVar35._4_4_ = fVar149 * auVar23._4_4_;
    auVar35._0_4_ = fVar116 * auVar23._0_4_;
    auVar35._8_4_ = fVar150 * auVar23._8_4_;
    auVar35._12_4_ = fVar182 * auVar23._12_4_;
    auVar35._16_4_ = fVar195 * auVar23._16_4_;
    auVar35._20_4_ = fVar196 * auVar23._20_4_;
    auVar35._24_4_ = fVar198 * auVar23._24_4_;
    auVar35._28_4_ = fStack_fc;
    auVar36._4_4_ = fVar231 * fStack_534;
    auVar36._0_4_ = fVar201 * local_538;
    auVar36._8_4_ = fVar233 * fStack_530;
    auVar36._12_4_ = fVar235 * fStack_52c;
    auVar36._16_4_ = fVar111 * fStack_528;
    auVar36._20_4_ = fVar112 * fStack_524;
    auVar36._24_4_ = fVar113 * fStack_520;
    auVar36._28_4_ = auVar23._28_4_;
    auVar29 = vsubps_avx(auVar35,auVar36);
    auVar37._4_4_ = fVar149 * local_388._4_4_;
    auVar37._0_4_ = fVar116 * local_388._0_4_;
    auVar37._8_4_ = fVar150 * local_388._8_4_;
    auVar37._12_4_ = fVar182 * local_388._12_4_;
    auVar37._16_4_ = fVar195 * local_388._16_4_;
    auVar37._20_4_ = fVar196 * local_388._20_4_;
    auVar37._24_4_ = fVar198 * local_388._24_4_;
    auVar37._28_4_ = auVar108._28_4_ + auVar24._28_4_;
    auVar24._4_4_ = auVar107._4_4_ * fVar231;
    auVar24._0_4_ = auVar107._0_4_ * fVar201;
    auVar24._8_4_ = auVar107._8_4_ * fVar233;
    auVar24._12_4_ = auVar107._12_4_ * fVar235;
    auVar24._16_4_ = auVar107._16_4_ * fVar111;
    auVar24._20_4_ = auVar107._20_4_ * fVar112;
    auVar24._24_4_ = auVar107._24_4_ * fVar113;
    auVar24._28_4_ = auVar145._28_4_ + auVar18._28_4_;
    auVar24 = vsubps_avx(auVar37,auVar24);
    auVar20 = vminps_avx(auVar25,auVar19);
    auVar105 = vmaxps_avx(auVar25,auVar19);
    auVar21 = vminps_avx(auVar26,auVar27);
    auVar21 = vminps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar26,auVar27);
    auVar105 = vmaxps_avx(auVar105,auVar20);
    auVar18 = vminps_avx(auVar28,auVar22);
    auVar20 = vmaxps_avx(auVar28,auVar22);
    auVar19 = vminps_avx(auVar29,auVar24);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar19 = vminps_avx(auVar21,auVar19);
    auVar21 = vmaxps_avx(auVar29,auVar24);
    auVar20 = vmaxps_avx(auVar20,auVar21);
    auVar20 = vmaxps_avx(auVar105,auVar20);
    auVar105 = vcmpps_avx(auVar19,local_78,2);
    auVar20 = vcmpps_avx(auVar20,local_228,5);
    auVar105 = vandps_avx(auVar20,auVar105);
    auVar20 = local_158 & auVar105;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(auVar106,local_98);
      auVar21 = vsubps_avx(auVar107,auVar278);
      fVar149 = auVar20._0_4_ + auVar21._0_4_;
      fVar150 = auVar20._4_4_ + auVar21._4_4_;
      fVar182 = auVar20._8_4_ + auVar21._8_4_;
      fVar195 = auVar20._12_4_ + auVar21._12_4_;
      fVar196 = auVar20._16_4_ + auVar21._16_4_;
      fVar198 = auVar20._20_4_ + auVar21._20_4_;
      fVar201 = auVar20._24_4_ + auVar21._24_4_;
      auVar19 = vsubps_avx(local_b8,auVar194);
      auVar22 = vsubps_avx(local_388,auVar311);
      fVar231 = auVar19._0_4_ + auVar22._0_4_;
      fVar233 = auVar19._4_4_ + auVar22._4_4_;
      fVar235 = auVar19._8_4_ + auVar22._8_4_;
      fVar111 = auVar19._12_4_ + auVar22._12_4_;
      fVar112 = auVar19._16_4_ + auVar22._16_4_;
      fVar113 = auVar19._20_4_ + auVar22._20_4_;
      fVar114 = auVar19._24_4_ + auVar22._24_4_;
      fVar116 = auVar22._28_4_;
      auVar38._4_4_ = auVar194._4_4_ * fVar150;
      auVar38._0_4_ = auVar194._0_4_ * fVar149;
      auVar38._8_4_ = auVar194._8_4_ * fVar182;
      auVar38._12_4_ = auVar194._12_4_ * fVar195;
      auVar38._16_4_ = auVar194._16_4_ * fVar196;
      auVar38._20_4_ = auVar194._20_4_ * fVar198;
      auVar38._24_4_ = auVar194._24_4_ * fVar201;
      auVar38._28_4_ = auVar194._28_4_;
      auVar39._4_4_ = local_98._4_4_ * fVar233;
      auVar39._0_4_ = local_98._0_4_ * fVar231;
      auVar39._8_4_ = local_98._8_4_ * fVar235;
      auVar39._12_4_ = local_98._12_4_ * fVar111;
      auVar39._16_4_ = local_98._16_4_ * fVar112;
      auVar39._20_4_ = local_98._20_4_ * fVar113;
      auVar39._24_4_ = local_98._24_4_ * fVar114;
      auVar39._28_4_ = local_98._28_4_;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar150 * fStack_f4;
      auVar40._0_4_ = fVar149 * local_f8;
      auVar40._8_4_ = fVar182 * fStack_f0;
      auVar40._12_4_ = fVar195 * fStack_ec;
      auVar40._16_4_ = fVar196 * fStack_e8;
      auVar40._20_4_ = fVar198 * fStack_e4;
      auVar40._24_4_ = fVar201 * fStack_e0;
      auVar40._28_4_ = auVar194._28_4_;
      auVar41._4_4_ = fVar233 * fStack_d4;
      auVar41._0_4_ = fVar231 * local_d8;
      auVar41._8_4_ = fVar235 * fStack_d0;
      auVar41._12_4_ = fVar111 * fStack_cc;
      auVar41._16_4_ = fVar112 * fStack_c8;
      auVar41._20_4_ = fVar113 * fStack_c4;
      auVar41._24_4_ = fVar114 * fStack_c0;
      auVar41._28_4_ = fVar116;
      auVar24 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = fVar150 * fStack_514;
      auVar42._0_4_ = fVar149 * local_518;
      auVar42._8_4_ = fVar182 * fStack_510;
      auVar42._12_4_ = fVar195 * fStack_50c;
      auVar42._16_4_ = fVar196 * fStack_508;
      auVar42._20_4_ = fVar198 * fStack_504;
      auVar42._24_4_ = fVar201 * fStack_500;
      auVar42._28_4_ = fVar116;
      auVar43._4_4_ = fVar233 * (float)local_598._4_4_;
      auVar43._0_4_ = fVar231 * (float)local_598._0_4_;
      auVar43._8_4_ = fVar235 * fStack_590;
      auVar43._12_4_ = fVar111 * fStack_58c;
      auVar43._16_4_ = fVar112 * fStack_588;
      auVar43._20_4_ = fVar113 * fStack_584;
      auVar43._24_4_ = fVar114 * fStack_580;
      auVar43._28_4_ = auVar18._28_4_;
      auVar108 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = local_b8._4_4_ * fVar150;
      auVar44._0_4_ = local_b8._0_4_ * fVar149;
      auVar44._8_4_ = local_b8._8_4_ * fVar182;
      auVar44._12_4_ = local_b8._12_4_ * fVar195;
      auVar44._16_4_ = local_b8._16_4_ * fVar196;
      auVar44._20_4_ = local_b8._20_4_ * fVar198;
      auVar44._24_4_ = local_b8._24_4_ * fVar201;
      auVar44._28_4_ = auVar18._28_4_;
      auVar45._4_4_ = auVar106._4_4_ * fVar233;
      auVar45._0_4_ = auVar106._0_4_ * fVar231;
      auVar45._8_4_ = auVar106._8_4_ * fVar235;
      auVar45._12_4_ = auVar106._12_4_ * fVar111;
      auVar45._16_4_ = auVar106._16_4_ * fVar112;
      auVar45._20_4_ = auVar106._20_4_ * fVar113;
      uVar6 = auVar106._28_4_;
      auVar45._24_4_ = auVar106._24_4_ * fVar114;
      auVar45._28_4_ = uVar6;
      auVar106 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = auVar311._4_4_ * fVar150;
      auVar46._0_4_ = auVar311._0_4_ * fVar149;
      auVar46._8_4_ = auVar311._8_4_ * fVar182;
      auVar46._12_4_ = auVar311._12_4_ * fVar195;
      auVar46._16_4_ = auVar311._16_4_ * fVar196;
      auVar46._20_4_ = auVar311._20_4_ * fVar198;
      auVar46._24_4_ = auVar311._24_4_ * fVar201;
      auVar46._28_4_ = uVar6;
      auVar47._4_4_ = auVar278._4_4_ * fVar233;
      auVar47._0_4_ = auVar278._0_4_ * fVar231;
      auVar47._8_4_ = auVar278._8_4_ * fVar235;
      auVar47._12_4_ = auVar278._12_4_ * fVar111;
      auVar47._16_4_ = auVar278._16_4_ * fVar112;
      auVar47._20_4_ = auVar278._20_4_ * fVar113;
      auVar47._24_4_ = auVar278._24_4_ * fVar114;
      auVar47._28_4_ = auVar278._28_4_;
      auVar145 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar150 * fStack_134;
      auVar48._0_4_ = fVar149 * local_138;
      auVar48._8_4_ = fVar182 * fStack_130;
      auVar48._12_4_ = fVar195 * fStack_12c;
      auVar48._16_4_ = fVar196 * fStack_128;
      auVar48._20_4_ = fVar198 * fStack_124;
      auVar48._24_4_ = fVar201 * fStack_120;
      auVar48._28_4_ = uVar6;
      auVar49._4_4_ = fVar233 * fStack_114;
      auVar49._0_4_ = fVar231 * local_118;
      auVar49._8_4_ = fVar235 * fStack_110;
      auVar49._12_4_ = fVar111 * fStack_10c;
      auVar49._16_4_ = fVar112 * fStack_108;
      auVar49._20_4_ = fVar113 * fStack_104;
      auVar49._24_4_ = fVar114 * fStack_100;
      auVar49._28_4_ = auVar311._28_4_;
      auVar25 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar150 * auVar23._4_4_;
      auVar50._0_4_ = fVar149 * auVar23._0_4_;
      auVar50._8_4_ = fVar182 * auVar23._8_4_;
      auVar50._12_4_ = fVar195 * auVar23._12_4_;
      auVar50._16_4_ = fVar196 * auVar23._16_4_;
      auVar50._20_4_ = fVar198 * auVar23._20_4_;
      auVar50._24_4_ = fVar201 * auVar23._24_4_;
      auVar50._28_4_ = auVar311._28_4_;
      auVar51._4_4_ = fStack_534 * fVar233;
      auVar51._0_4_ = local_538 * fVar231;
      auVar51._8_4_ = fStack_530 * fVar235;
      auVar51._12_4_ = fStack_52c * fVar111;
      auVar51._16_4_ = fStack_528 * fVar112;
      auVar51._20_4_ = fStack_524 * fVar113;
      auVar51._24_4_ = fStack_520 * fVar114;
      auVar51._28_4_ = local_b8._28_4_;
      auVar23 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = local_388._4_4_ * fVar150;
      auVar52._0_4_ = local_388._0_4_ * fVar149;
      auVar52._8_4_ = local_388._8_4_ * fVar182;
      auVar52._12_4_ = local_388._12_4_ * fVar195;
      auVar52._16_4_ = local_388._16_4_ * fVar196;
      auVar52._20_4_ = local_388._20_4_ * fVar198;
      auVar52._24_4_ = local_388._24_4_ * fVar201;
      auVar52._28_4_ = auVar20._28_4_ + auVar21._28_4_;
      auVar53._4_4_ = auVar107._4_4_ * fVar233;
      auVar53._0_4_ = auVar107._0_4_ * fVar231;
      auVar53._8_4_ = auVar107._8_4_ * fVar235;
      auVar53._12_4_ = auVar107._12_4_ * fVar111;
      auVar53._16_4_ = auVar107._16_4_ * fVar112;
      auVar53._20_4_ = auVar107._20_4_ * fVar113;
      auVar53._24_4_ = auVar107._24_4_ * fVar114;
      auVar53._28_4_ = auVar19._28_4_ + fVar116;
      auVar107 = vsubps_avx(auVar52,auVar53);
      auVar21 = vminps_avx(auVar22,auVar24);
      auVar20 = vmaxps_avx(auVar22,auVar24);
      auVar18 = vminps_avx(auVar108,auVar106);
      auVar18 = vminps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar108,auVar106);
      auVar20 = vmaxps_avx(auVar20,auVar21);
      auVar19 = vminps_avx(auVar145,auVar25);
      auVar21 = vmaxps_avx(auVar145,auVar25);
      auVar106 = vminps_avx(auVar23,auVar107);
      auVar19 = vminps_avx(auVar19,auVar106);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar23,auVar107);
      auVar21 = vmaxps_avx(auVar21,auVar18);
      auVar21 = vmaxps_avx(auVar20,auVar21);
      auVar20 = vcmpps_avx(auVar19,local_78,2);
      auVar21 = vcmpps_avx(auVar21,local_228,5);
      auVar20 = vandps_avx(auVar21,auVar20);
      auVar105 = vandps_avx(local_158,auVar105);
      auVar21 = auVar105 & auVar20;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar20,auVar105);
        uVar70 = vmovmskps_avx(auVar105);
        if (uVar70 != 0) {
          uVar68 = (ulong)uVar69;
          auStack_3c8[uVar68] = uVar70 & 0xff;
          uVar7 = vmovlps_avx(local_2e8);
          *(undefined8 *)(afStack_208 + uVar68 * 2) = uVar7;
          uVar67 = vmovlps_avx(auVar89);
          auStack_58[uVar68] = uVar67;
          uVar69 = uVar69 + 1;
        }
      }
    }
LAB_00f58f64:
    do {
      do {
        do {
          do {
            if (uVar69 == 0) {
              if ((uVar65 & 1) != 0) goto LAB_00f59ff4;
              uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar104._4_4_ = uVar6;
              auVar104._0_4_ = uVar6;
              auVar104._8_4_ = uVar6;
              auVar104._12_4_ = uVar6;
              auVar93 = vcmpps_avx(local_2f8,auVar104,2);
              uVar64 = vmovmskps_avx(auVar93);
              uVar63 = uVar63 & uVar63 + 0xf & uVar64;
              if (uVar63 != 0) goto LAB_00f57c70;
              goto LAB_00f59ff4;
            }
            uVar68 = (ulong)(uVar69 - 1);
            uVar70 = auStack_3c8[uVar68];
            fVar116 = afStack_208[uVar68 * 2];
            fVar149 = afStack_208[uVar68 * 2 + 1];
            auVar89._8_8_ = 0;
            auVar89._0_8_ = auStack_58[uVar68];
            uVar67 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            auStack_3c8[uVar68] = uVar70;
            if (uVar70 == 0) {
              uVar69 = uVar69 - 1;
            }
            fVar182 = (float)(uVar67 + 1) * 0.14285715;
            fVar150 = (1.0 - (float)uVar67 * 0.14285715) * fVar116 +
                      fVar149 * (float)uVar67 * 0.14285715;
            fVar116 = (1.0 - fVar182) * fVar116 + fVar149 * fVar182;
            fVar149 = fVar116 - fVar150;
            if (0.16666667 <= fVar149) {
              local_2e8 = vinsertps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar116),0x10);
              goto LAB_00f58926;
            }
            auVar93 = vshufps_avx(auVar89,auVar89,0x50);
            auVar126._8_4_ = 0x3f800000;
            auVar126._0_8_ = 0x3f8000003f800000;
            auVar126._12_4_ = 0x3f800000;
            auVar207 = vsubps_avx(auVar126,auVar93);
            fVar182 = auVar93._0_4_;
            fVar195 = auVar93._4_4_;
            fVar196 = auVar93._8_4_;
            fVar198 = auVar93._12_4_;
            fVar201 = auVar207._0_4_;
            fVar231 = auVar207._4_4_;
            fVar233 = auVar207._8_4_;
            fVar235 = auVar207._12_4_;
            auVar164._0_4_ = fVar182 * auVar291._0_4_ + fVar201 * (float)local_5e8._0_4_;
            auVar164._4_4_ = fVar195 * auVar291._4_4_ + fVar231 * (float)local_5e8._4_4_;
            auVar164._8_4_ = fVar196 * auVar291._0_4_ + fVar233 * (float)local_5e8._0_4_;
            auVar164._12_4_ = fVar198 * auVar291._4_4_ + fVar235 * (float)local_5e8._4_4_;
            auVar218._0_4_ = fVar182 * auVar304._0_4_ + fVar201 * auVar350._0_4_;
            auVar218._4_4_ = fVar195 * auVar304._4_4_ + fVar231 * auVar350._4_4_;
            auVar218._8_4_ = fVar196 * auVar304._0_4_ + fVar233 * auVar350._0_4_;
            auVar218._12_4_ = fVar198 * auVar304._4_4_ + fVar235 * auVar350._4_4_;
            auVar243._0_4_ = fVar182 * auVar320._0_4_ + auVar337._0_4_ * fVar201;
            auVar243._4_4_ = fVar195 * auVar320._4_4_ + auVar337._4_4_ * fVar231;
            auVar243._8_4_ = fVar196 * auVar320._0_4_ + auVar337._0_4_ * fVar233;
            auVar243._12_4_ = fVar198 * auVar320._4_4_ + auVar337._4_4_ * fVar235;
            auVar90._0_4_ = fVar182 * auVar87._0_4_ + fVar201 * auVar125._0_4_;
            auVar90._4_4_ = fVar195 * auVar87._4_4_ + fVar231 * auVar125._4_4_;
            auVar90._8_4_ = fVar196 * auVar87._0_4_ + fVar233 * auVar125._0_4_;
            auVar90._12_4_ = fVar198 * auVar87._4_4_ + fVar235 * auVar125._4_4_;
            auVar146._16_16_ = auVar164;
            auVar146._0_16_ = auVar164;
            auVar180._16_16_ = auVar218;
            auVar180._0_16_ = auVar218;
            auVar230._16_16_ = auVar243;
            auVar230._0_16_ = auVar243;
            auVar105 = ZEXT2032(CONCAT416(fVar116,ZEXT416((uint)fVar150)));
            auVar105 = vshufps_avx(auVar105,auVar105,0);
            auVar20 = vsubps_avx(auVar180,auVar146);
            fVar182 = auVar105._0_4_;
            fVar195 = auVar105._4_4_;
            fVar196 = auVar105._8_4_;
            fVar198 = auVar105._12_4_;
            fVar201 = auVar105._16_4_;
            fVar231 = auVar105._20_4_;
            fVar233 = auVar105._24_4_;
            auVar147._0_4_ = auVar164._0_4_ + auVar20._0_4_ * fVar182;
            auVar147._4_4_ = auVar164._4_4_ + auVar20._4_4_ * fVar195;
            auVar147._8_4_ = auVar164._8_4_ + auVar20._8_4_ * fVar196;
            auVar147._12_4_ = auVar164._12_4_ + auVar20._12_4_ * fVar198;
            auVar147._16_4_ = auVar164._0_4_ + auVar20._16_4_ * fVar201;
            auVar147._20_4_ = auVar164._4_4_ + auVar20._20_4_ * fVar231;
            auVar147._24_4_ = auVar164._8_4_ + auVar20._24_4_ * fVar233;
            auVar147._28_4_ = auVar164._12_4_ + auVar20._28_4_;
            auVar105 = vsubps_avx(auVar230,auVar180);
            auVar181._0_4_ = auVar218._0_4_ + auVar105._0_4_ * fVar182;
            auVar181._4_4_ = auVar218._4_4_ + auVar105._4_4_ * fVar195;
            auVar181._8_4_ = auVar218._8_4_ + auVar105._8_4_ * fVar196;
            auVar181._12_4_ = auVar218._12_4_ + auVar105._12_4_ * fVar198;
            auVar181._16_4_ = auVar218._0_4_ + auVar105._16_4_ * fVar201;
            auVar181._20_4_ = auVar218._4_4_ + auVar105._20_4_ * fVar231;
            auVar181._24_4_ = auVar218._8_4_ + auVar105._24_4_ * fVar233;
            auVar181._28_4_ = auVar218._12_4_ + auVar105._28_4_;
            auVar93 = vsubps_avx(auVar90,auVar243);
            auVar109._0_4_ = auVar243._0_4_ + auVar93._0_4_ * fVar182;
            auVar109._4_4_ = auVar243._4_4_ + auVar93._4_4_ * fVar195;
            auVar109._8_4_ = auVar243._8_4_ + auVar93._8_4_ * fVar196;
            auVar109._12_4_ = auVar243._12_4_ + auVar93._12_4_ * fVar198;
            auVar109._16_4_ = auVar243._0_4_ + auVar93._0_4_ * fVar201;
            auVar109._20_4_ = auVar243._4_4_ + auVar93._4_4_ * fVar231;
            auVar109._24_4_ = auVar243._8_4_ + auVar93._8_4_ * fVar233;
            auVar109._28_4_ = auVar243._12_4_ + auVar93._12_4_;
            auVar105 = vsubps_avx(auVar181,auVar147);
            auVar148._0_4_ = auVar147._0_4_ + fVar182 * auVar105._0_4_;
            auVar148._4_4_ = auVar147._4_4_ + fVar195 * auVar105._4_4_;
            auVar148._8_4_ = auVar147._8_4_ + fVar196 * auVar105._8_4_;
            auVar148._12_4_ = auVar147._12_4_ + fVar198 * auVar105._12_4_;
            auVar148._16_4_ = auVar147._16_4_ + fVar201 * auVar105._16_4_;
            auVar148._20_4_ = auVar147._20_4_ + fVar231 * auVar105._20_4_;
            auVar148._24_4_ = auVar147._24_4_ + fVar233 * auVar105._24_4_;
            auVar148._28_4_ = auVar147._28_4_ + auVar105._28_4_;
            auVar105 = vsubps_avx(auVar109,auVar181);
            auVar110._0_4_ = auVar181._0_4_ + fVar182 * auVar105._0_4_;
            auVar110._4_4_ = auVar181._4_4_ + fVar195 * auVar105._4_4_;
            auVar110._8_4_ = auVar181._8_4_ + fVar196 * auVar105._8_4_;
            auVar110._12_4_ = auVar181._12_4_ + fVar198 * auVar105._12_4_;
            auVar110._16_4_ = auVar181._16_4_ + fVar201 * auVar105._16_4_;
            auVar110._20_4_ = auVar181._20_4_ + fVar231 * auVar105._20_4_;
            auVar110._24_4_ = auVar181._24_4_ + fVar233 * auVar105._24_4_;
            auVar110._28_4_ = auVar181._28_4_ + auVar105._28_4_;
            auVar105 = vsubps_avx(auVar110,auVar148);
            auVar263._0_4_ = auVar148._0_4_ + fVar182 * auVar105._0_4_;
            auVar263._4_4_ = auVar148._4_4_ + fVar195 * auVar105._4_4_;
            auVar263._8_4_ = auVar148._8_4_ + fVar196 * auVar105._8_4_;
            auVar263._12_4_ = auVar148._12_4_ + fVar198 * auVar105._12_4_;
            auVar266._16_4_ = auVar148._16_4_ + fVar201 * auVar105._16_4_;
            auVar266._0_16_ = auVar263;
            auVar266._20_4_ = auVar148._20_4_ + fVar231 * auVar105._20_4_;
            auVar266._24_4_ = auVar148._24_4_ + fVar233 * auVar105._24_4_;
            auVar266._28_4_ = auVar148._28_4_ + auVar181._28_4_;
            auVar267 = auVar266._16_16_;
            auVar128 = vshufps_avx(ZEXT416((uint)(fVar149 * 0.33333334)),
                                   ZEXT416((uint)(fVar149 * 0.33333334)),0);
            auVar244._0_4_ = auVar263._0_4_ + auVar128._0_4_ * auVar105._0_4_ * 3.0;
            auVar244._4_4_ = auVar263._4_4_ + auVar128._4_4_ * auVar105._4_4_ * 3.0;
            auVar244._8_4_ = auVar263._8_4_ + auVar128._8_4_ * auVar105._8_4_ * 3.0;
            auVar244._12_4_ = auVar263._12_4_ + auVar128._12_4_ * auVar105._12_4_ * 3.0;
            auVar177 = vshufpd_avx(auVar263,auVar263,3);
            auVar139 = vshufpd_avx(auVar267,auVar267,3);
            auVar93 = vsubps_avx(auVar177,auVar263);
            auVar207 = vsubps_avx(auVar139,auVar267);
            auVar91._0_4_ = auVar93._0_4_ + auVar207._0_4_;
            auVar91._4_4_ = auVar93._4_4_ + auVar207._4_4_;
            auVar91._8_4_ = auVar93._8_4_ + auVar207._8_4_;
            auVar91._12_4_ = auVar93._12_4_ + auVar207._12_4_;
            auVar93 = vmovshdup_avx(auVar263);
            auVar207 = vmovshdup_avx(auVar244);
            auVar167 = vshufps_avx(auVar91,auVar91,0);
            auVar129 = vshufps_avx(auVar91,auVar91,0x55);
            fVar182 = auVar129._0_4_;
            fVar195 = auVar129._4_4_;
            fVar196 = auVar129._8_4_;
            fVar198 = auVar129._12_4_;
            fVar201 = auVar167._0_4_;
            fVar231 = auVar167._4_4_;
            fVar233 = auVar167._8_4_;
            fVar235 = auVar167._12_4_;
            auVar92._0_4_ = fVar201 * auVar263._0_4_ + auVar93._0_4_ * fVar182;
            auVar92._4_4_ = fVar231 * auVar263._4_4_ + auVar93._4_4_ * fVar195;
            auVar92._8_4_ = fVar233 * auVar263._8_4_ + auVar93._8_4_ * fVar196;
            auVar92._12_4_ = fVar235 * auVar263._12_4_ + auVar93._12_4_ * fVar198;
            auVar165._0_4_ = fVar201 * auVar244._0_4_ + auVar207._0_4_ * fVar182;
            auVar165._4_4_ = fVar231 * auVar244._4_4_ + auVar207._4_4_ * fVar195;
            auVar165._8_4_ = fVar233 * auVar244._8_4_ + auVar207._8_4_ * fVar196;
            auVar165._12_4_ = fVar235 * auVar244._12_4_ + auVar207._12_4_ * fVar198;
            auVar207 = vshufps_avx(auVar92,auVar92,0xe8);
            auVar167 = vshufps_avx(auVar165,auVar165,0xe8);
            auVar93 = vcmpps_avx(auVar207,auVar167,1);
            uVar70 = vextractps_avx(auVar93,0);
            auVar129 = auVar165;
            if ((uVar70 & 1) == 0) {
              auVar129 = auVar92;
            }
            auVar127._0_4_ = auVar128._0_4_ * auVar105._16_4_ * 3.0;
            auVar127._4_4_ = auVar128._4_4_ * auVar105._20_4_ * 3.0;
            auVar127._8_4_ = auVar128._8_4_ * auVar105._24_4_ * 3.0;
            auVar127._12_4_ = auVar128._12_4_ * 0.0;
            auVar73 = vsubps_avx(auVar267,auVar127);
            auVar128 = vmovshdup_avx(auVar73);
            auVar267 = vmovshdup_avx(auVar267);
            fVar111 = auVar73._0_4_;
            fVar112 = auVar73._4_4_;
            auVar219._0_4_ = fVar111 * fVar201 + auVar128._0_4_ * fVar182;
            auVar219._4_4_ = fVar112 * fVar231 + auVar128._4_4_ * fVar195;
            auVar219._8_4_ = auVar73._8_4_ * fVar233 + auVar128._8_4_ * fVar196;
            auVar219._12_4_ = auVar73._12_4_ * fVar235 + auVar128._12_4_ * fVar198;
            auVar245._0_4_ = fVar201 * auVar266._16_4_ + auVar267._0_4_ * fVar182;
            auVar245._4_4_ = fVar231 * auVar266._20_4_ + auVar267._4_4_ * fVar195;
            auVar245._8_4_ = fVar233 * auVar266._24_4_ + auVar267._8_4_ * fVar196;
            auVar245._12_4_ = fVar235 * auVar266._28_4_ + auVar267._12_4_ * fVar198;
            auVar267 = vshufps_avx(auVar219,auVar219,0xe8);
            auVar17 = vshufps_avx(auVar245,auVar245,0xe8);
            auVar128 = vcmpps_avx(auVar267,auVar17,1);
            uVar70 = vextractps_avx(auVar128,0);
            auVar74 = auVar245;
            if ((uVar70 & 1) == 0) {
              auVar74 = auVar219;
            }
            auVar129 = vmaxss_avx(auVar74,auVar129);
            auVar207 = vminps_avx(auVar207,auVar167);
            auVar167 = vminps_avx(auVar267,auVar17);
            auVar167 = vminps_avx(auVar207,auVar167);
            auVar93 = vshufps_avx(auVar93,auVar93,0x55);
            auVar93 = vblendps_avx(auVar93,auVar128,2);
            auVar128 = vpslld_avx(auVar93,0x1f);
            auVar93 = vshufpd_avx(auVar165,auVar165,1);
            auVar93 = vinsertps_avx(auVar93,auVar245,0x9c);
            auVar207 = vshufpd_avx(auVar92,auVar92,1);
            auVar207 = vinsertps_avx(auVar207,auVar219,0x9c);
            auVar93 = vblendvps_avx(auVar207,auVar93,auVar128);
            auVar207 = vmovshdup_avx(auVar93);
            auVar93 = vmaxss_avx(auVar207,auVar93);
            fVar196 = auVar167._0_4_;
            auVar207 = vmovshdup_avx(auVar167);
            fVar195 = auVar93._0_4_;
            fVar198 = auVar207._0_4_;
            fVar182 = auVar129._0_4_;
            if ((fVar196 < 0.0001) && (-0.0001 < fVar195)) break;
            if ((fVar198 < 0.0001 && -0.0001 < fVar182) || (fVar196 < 0.0001 && -0.0001 < fVar182))
            break;
            auVar128 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar93,1);
            auVar207 = vcmpps_avx(auVar207,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar207 = vandps_avx(auVar207,auVar128);
          } while ((auVar207 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar128 = vcmpps_avx(auVar167,_DAT_01f7aa10,1);
          auVar207 = vcmpss_avx(auVar129,ZEXT416(0),1);
          auVar166._8_4_ = 0x3f800000;
          auVar166._0_8_ = 0x3f8000003f800000;
          auVar166._12_4_ = 0x3f800000;
          auVar220._8_4_ = 0xbf800000;
          auVar220._0_8_ = 0xbf800000bf800000;
          auVar220._12_4_ = 0xbf800000;
          auVar207 = vblendvps_avx(auVar166,auVar220,auVar207);
          auVar128 = vblendvps_avx(auVar166,auVar220,auVar128);
          auVar167 = vcmpss_avx(auVar128,auVar207,4);
          auVar167 = vpshufd_avx(ZEXT416(auVar167._0_4_ & 1),0x50);
          auVar167 = vpslld_avx(auVar167,0x1f);
          auVar167 = vpsrad_avx(auVar167,0x1f);
          auVar167 = vpandn_avx(auVar167,_DAT_01fafeb0);
          auVar129 = vmovshdup_avx(auVar128);
          fVar201 = auVar129._0_4_;
          if ((auVar128._0_4_ != fVar201) || (NAN(auVar128._0_4_) || NAN(fVar201))) {
            if ((fVar198 != fVar196) || (NAN(fVar198) || NAN(fVar196))) {
              fVar196 = -fVar196 / (fVar198 - fVar196);
              auVar128 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar196) * 0.0 + fVar196)));
            }
            else {
              auVar128 = ZEXT816(0x3f80000000000000);
              if ((fVar196 != 0.0) || (NAN(fVar196))) {
                auVar128 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar267 = vcmpps_avx(auVar167,auVar128,1);
            auVar129 = vblendps_avx(auVar167,auVar128,2);
            auVar128 = vblendps_avx(auVar128,auVar167,2);
            auVar167 = vblendvps_avx(auVar128,auVar129,auVar267);
          }
          auVar93 = vcmpss_avx(auVar93,ZEXT416(0),1);
          auVar168._8_4_ = 0x3f800000;
          auVar168._0_8_ = 0x3f8000003f800000;
          auVar168._12_4_ = 0x3f800000;
          auVar221._8_4_ = 0xbf800000;
          auVar221._0_8_ = 0xbf800000bf800000;
          auVar221._12_4_ = 0xbf800000;
          auVar93 = vblendvps_avx(auVar168,auVar221,auVar93);
          fVar196 = auVar93._0_4_;
          if ((auVar207._0_4_ != fVar196) || (NAN(auVar207._0_4_) || NAN(fVar196))) {
            if ((fVar195 != fVar182) || (NAN(fVar195) || NAN(fVar182))) {
              fVar182 = -fVar182 / (fVar195 - fVar182);
              auVar93 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar182) * 0.0 + fVar182)));
            }
            else {
              auVar93 = ZEXT816(0x3f80000000000000);
              if ((fVar182 != 0.0) || (NAN(fVar182))) {
                auVar93 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar128 = vcmpps_avx(auVar167,auVar93,1);
            auVar207 = vblendps_avx(auVar167,auVar93,2);
            auVar93 = vblendps_avx(auVar93,auVar167,2);
            auVar167 = vblendvps_avx(auVar93,auVar207,auVar128);
          }
          if ((fVar201 != fVar196) || (NAN(fVar201) || NAN(fVar196))) {
            auVar94._8_4_ = 0x3f800000;
            auVar94._0_8_ = 0x3f8000003f800000;
            auVar94._12_4_ = 0x3f800000;
            auVar93 = vcmpps_avx(auVar167,auVar94,1);
            auVar207 = vinsertps_avx(auVar167,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar169._4_12_ = auVar167._4_12_;
            auVar169._0_4_ = 0x3f800000;
            auVar167 = vblendvps_avx(auVar169,auVar207,auVar93);
          }
          auVar93 = vcmpps_avx(auVar167,_DAT_01f7b6f0,1);
          auVar55._12_4_ = 0;
          auVar55._0_12_ = auVar167._4_12_;
          auVar207 = vinsertps_avx(auVar167,ZEXT416(0x3f800000),0x10);
          auVar93 = vblendvps_avx(auVar207,auVar55 << 0x20,auVar93);
          auVar207 = vmovshdup_avx(auVar93);
        } while (auVar207._0_4_ < auVar93._0_4_);
        auVar95._0_4_ = auVar93._0_4_ + -0.1;
        auVar95._4_4_ = auVar93._4_4_ + 0.1;
        auVar95._8_4_ = auVar93._8_4_ + 0.0;
        auVar95._12_4_ = auVar93._12_4_ + 0.0;
        auVar128 = vshufpd_avx(auVar244,auVar244,3);
        auVar264._8_8_ = 0x3f80000000000000;
        auVar264._0_8_ = 0x3f80000000000000;
        auVar93 = vcmpps_avx(auVar95,auVar264,1);
        auVar54._12_4_ = 0;
        auVar54._0_12_ = auVar95._4_12_;
        auVar207 = vinsertps_avx(auVar95,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar93 = vblendvps_avx(auVar207,auVar54 << 0x20,auVar93);
        auVar207 = vshufpd_avx(auVar73,auVar73,3);
        auVar167 = vshufps_avx(auVar93,auVar93,0x50);
        auVar265._8_4_ = 0x3f800000;
        auVar265._0_8_ = 0x3f8000003f800000;
        auVar265._12_4_ = 0x3f800000;
        auVar129 = vsubps_avx(auVar265,auVar167);
        local_468 = auVar177._0_4_;
        fStack_464 = auVar177._4_4_;
        fStack_460 = auVar177._8_4_;
        fStack_45c = auVar177._12_4_;
        fVar182 = auVar167._0_4_;
        fVar195 = auVar167._4_4_;
        fVar196 = auVar167._8_4_;
        fVar198 = auVar167._12_4_;
        local_578 = auVar139._0_4_;
        fStack_574 = auVar139._4_4_;
        fStack_570 = auVar139._8_4_;
        fStack_56c = auVar139._12_4_;
        fVar201 = auVar129._0_4_;
        fVar231 = auVar129._4_4_;
        fVar233 = auVar129._8_4_;
        fVar235 = auVar129._12_4_;
        auVar96._0_4_ = fVar182 * local_468 + fVar201 * auVar263._0_4_;
        auVar96._4_4_ = fVar195 * fStack_464 + fVar231 * auVar263._4_4_;
        auVar96._8_4_ = fVar196 * fStack_460 + fVar233 * auVar263._0_4_;
        auVar96._12_4_ = fVar198 * fStack_45c + fVar235 * auVar263._4_4_;
        auVar170._0_4_ = fVar182 * auVar128._0_4_ + fVar201 * auVar244._0_4_;
        auVar170._4_4_ = fVar195 * auVar128._4_4_ + fVar231 * auVar244._4_4_;
        auVar170._8_4_ = fVar196 * auVar128._8_4_ + fVar233 * auVar244._0_4_;
        auVar170._12_4_ = fVar198 * auVar128._12_4_ + fVar235 * auVar244._4_4_;
        auVar246._0_4_ = fVar182 * auVar207._0_4_ + fVar201 * fVar111;
        auVar246._4_4_ = fVar195 * auVar207._4_4_ + fVar231 * fVar112;
        auVar246._8_4_ = fVar196 * auVar207._8_4_ + fVar233 * fVar111;
        auVar246._12_4_ = fVar198 * auVar207._12_4_ + fVar235 * fVar112;
        auVar277._0_4_ = fVar182 * local_578 + fVar201 * auVar266._16_4_;
        auVar277._4_4_ = fVar195 * fStack_574 + fVar231 * auVar266._20_4_;
        auVar277._8_4_ = fVar196 * fStack_570 + fVar233 * auVar266._16_4_;
        auVar277._12_4_ = fVar198 * fStack_56c + fVar235 * auVar266._20_4_;
        auVar139 = vsubps_avx(auVar265,auVar93);
        auVar207 = vmovshdup_avx(auVar89);
        auVar177 = vmovsldup_avx(auVar89);
        auVar89._0_4_ = auVar177._0_4_ * auVar139._0_4_ + auVar93._0_4_ * auVar207._0_4_;
        auVar89._4_4_ = auVar177._4_4_ * auVar139._4_4_ + auVar93._4_4_ * auVar207._4_4_;
        auVar89._8_4_ = auVar177._8_4_ * auVar139._8_4_ + auVar93._8_4_ * auVar207._8_4_;
        auVar89._12_4_ = auVar177._12_4_ * auVar139._12_4_ + auVar93._12_4_ * auVar207._12_4_;
        auVar73 = vmovshdup_avx(auVar89);
        auVar93 = vsubps_avx(auVar170,auVar96);
        auVar192._0_4_ = auVar93._0_4_ * 3.0;
        auVar192._4_4_ = auVar93._4_4_ * 3.0;
        auVar192._8_4_ = auVar93._8_4_ * 3.0;
        auVar192._12_4_ = auVar93._12_4_ * 3.0;
        auVar93 = vsubps_avx(auVar246,auVar170);
        auVar292._0_4_ = auVar93._0_4_ * 3.0;
        auVar292._4_4_ = auVar93._4_4_ * 3.0;
        auVar292._8_4_ = auVar93._8_4_ * 3.0;
        auVar292._12_4_ = auVar93._12_4_ * 3.0;
        auVar93 = vsubps_avx(auVar277,auVar246);
        auVar305._0_4_ = auVar93._0_4_ * 3.0;
        auVar305._4_4_ = auVar93._4_4_ * 3.0;
        auVar305._8_4_ = auVar93._8_4_ * 3.0;
        auVar305._12_4_ = auVar93._12_4_ * 3.0;
        auVar207 = vminps_avx(auVar292,auVar305);
        auVar93 = vmaxps_avx(auVar292,auVar305);
        auVar207 = vminps_avx(auVar192,auVar207);
        auVar93 = vmaxps_avx(auVar192,auVar93);
        auVar177 = vshufpd_avx(auVar207,auVar207,3);
        auVar139 = vshufpd_avx(auVar93,auVar93,3);
        auVar207 = vminps_avx(auVar207,auVar177);
        auVar93 = vmaxps_avx(auVar93,auVar139);
        auVar177 = vshufps_avx(ZEXT416((uint)(1.0 / fVar149)),ZEXT416((uint)(1.0 / fVar149)),0);
        auVar293._0_4_ = auVar207._0_4_ * auVar177._0_4_;
        auVar293._4_4_ = auVar207._4_4_ * auVar177._4_4_;
        auVar293._8_4_ = auVar207._8_4_ * auVar177._8_4_;
        auVar293._12_4_ = auVar207._12_4_ * auVar177._12_4_;
        auVar306._0_4_ = auVar177._0_4_ * auVar93._0_4_;
        auVar306._4_4_ = auVar177._4_4_ * auVar93._4_4_;
        auVar306._8_4_ = auVar177._8_4_ * auVar93._8_4_;
        auVar306._12_4_ = auVar177._12_4_ * auVar93._12_4_;
        auVar129 = ZEXT416((uint)(1.0 / (auVar73._0_4_ - auVar89._0_4_)));
        auVar93 = vshufpd_avx(auVar96,auVar96,3);
        auVar207 = vshufpd_avx(auVar170,auVar170,3);
        auVar177 = vshufpd_avx(auVar246,auVar246,3);
        auVar139 = vshufpd_avx(auVar277,auVar277,3);
        auVar93 = vsubps_avx(auVar93,auVar96);
        auVar128 = vsubps_avx(auVar207,auVar170);
        auVar167 = vsubps_avx(auVar177,auVar246);
        auVar139 = vsubps_avx(auVar139,auVar277);
        auVar207 = vminps_avx(auVar93,auVar128);
        auVar93 = vmaxps_avx(auVar93,auVar128);
        auVar177 = vminps_avx(auVar167,auVar139);
        auVar177 = vminps_avx(auVar207,auVar177);
        auVar207 = vmaxps_avx(auVar167,auVar139);
        auVar93 = vmaxps_avx(auVar93,auVar207);
        auVar207 = vshufps_avx(auVar129,auVar129,0);
        auVar351._0_4_ = auVar207._0_4_ * auVar177._0_4_;
        auVar351._4_4_ = auVar207._4_4_ * auVar177._4_4_;
        auVar351._8_4_ = auVar207._8_4_ * auVar177._8_4_;
        auVar351._12_4_ = auVar207._12_4_ * auVar177._12_4_;
        auVar355._0_4_ = auVar207._0_4_ * auVar93._0_4_;
        auVar355._4_4_ = auVar207._4_4_ * auVar93._4_4_;
        auVar355._8_4_ = auVar207._8_4_ * auVar93._8_4_;
        auVar355._12_4_ = auVar207._12_4_ * auVar93._12_4_;
        auVar93 = vmovsldup_avx(auVar89);
        auVar321._4_12_ = auVar93._4_12_;
        auVar321._0_4_ = fVar150;
        auVar326._4_12_ = auVar89._4_12_;
        auVar326._0_4_ = fVar116;
        auVar193._0_4_ = (fVar150 + fVar116) * 0.5;
        auVar193._4_4_ = (auVar93._4_4_ + auVar89._4_4_) * 0.5;
        auVar193._8_4_ = (auVar93._8_4_ + auVar89._8_4_) * 0.5;
        auVar193._12_4_ = (auVar93._12_4_ + auVar89._12_4_) * 0.5;
        auVar93 = vshufps_avx(auVar193,auVar193,0);
        fVar182 = auVar93._0_4_;
        fVar195 = auVar93._4_4_;
        fVar196 = auVar93._8_4_;
        fVar198 = auVar93._12_4_;
        local_5c8._0_4_ = auVar214._0_4_;
        local_5c8._4_4_ = auVar214._4_4_;
        fStack_5c0 = auVar214._8_4_;
        fStack_5bc = auVar214._12_4_;
        auVar130._0_4_ = fVar182 * (float)local_238._0_4_ + (float)local_5c8._0_4_;
        auVar130._4_4_ = fVar195 * (float)local_238._4_4_ + (float)local_5c8._4_4_;
        auVar130._8_4_ = fVar196 * fStack_230 + fStack_5c0;
        auVar130._12_4_ = fVar198 * fStack_22c + fStack_5bc;
        local_548 = auVar15._0_4_;
        fStack_544 = auVar15._4_4_;
        fStack_540 = auVar15._8_4_;
        fStack_53c = auVar15._12_4_;
        auVar171._0_4_ = fVar182 * (float)local_248._0_4_ + local_548;
        auVar171._4_4_ = fVar195 * (float)local_248._4_4_ + fStack_544;
        auVar171._8_4_ = fVar196 * fStack_240 + fStack_540;
        auVar171._12_4_ = fVar198 * fStack_23c + fStack_53c;
        local_558 = auVar16._0_4_;
        fStack_554 = auVar16._4_4_;
        fStack_550 = auVar16._8_4_;
        fStack_54c = auVar16._12_4_;
        auVar247._0_4_ = fVar182 * (float)local_258._0_4_ + local_558;
        auVar247._4_4_ = fVar195 * (float)local_258._4_4_ + fStack_554;
        auVar247._8_4_ = fVar196 * fStack_250 + fStack_550;
        auVar247._12_4_ = fVar198 * fStack_24c + fStack_54c;
        auVar93 = vsubps_avx(auVar171,auVar130);
        auVar131._0_4_ = auVar130._0_4_ + fVar182 * auVar93._0_4_;
        auVar131._4_4_ = auVar130._4_4_ + fVar195 * auVar93._4_4_;
        auVar131._8_4_ = auVar130._8_4_ + fVar196 * auVar93._8_4_;
        auVar131._12_4_ = auVar130._12_4_ + fVar198 * auVar93._12_4_;
        auVar93 = vsubps_avx(auVar247,auVar171);
        auVar172._0_4_ = auVar171._0_4_ + fVar182 * auVar93._0_4_;
        auVar172._4_4_ = auVar171._4_4_ + fVar195 * auVar93._4_4_;
        auVar172._8_4_ = auVar171._8_4_ + fVar196 * auVar93._8_4_;
        auVar172._12_4_ = auVar171._12_4_ + fVar198 * auVar93._12_4_;
        auVar93 = vsubps_avx(auVar172,auVar131);
        fVar182 = auVar131._0_4_ + fVar182 * auVar93._0_4_;
        fVar195 = auVar131._4_4_ + fVar195 * auVar93._4_4_;
        auVar97._0_8_ = CONCAT44(fVar195,fVar182);
        auVar97._8_4_ = auVar131._8_4_ + fVar196 * auVar93._8_4_;
        auVar97._12_4_ = auVar131._12_4_ + fVar198 * auVar93._12_4_;
        fVar196 = auVar93._0_4_ * 3.0;
        fVar198 = auVar93._4_4_ * 3.0;
        auVar132._0_8_ = CONCAT44(fVar198,fVar196);
        auVar132._8_4_ = auVar93._8_4_ * 3.0;
        auVar132._12_4_ = auVar93._12_4_ * 3.0;
        auVar173._8_8_ = auVar97._0_8_;
        auVar173._0_8_ = auVar97._0_8_;
        auVar93 = vshufpd_avx(auVar97,auVar97,3);
        auVar207 = vshufps_avx(auVar193,auVar193,0x55);
        auVar167 = vsubps_avx(auVar93,auVar173);
        auVar338._0_4_ = auVar167._0_4_ * auVar207._0_4_ + fVar182;
        auVar338._4_4_ = auVar167._4_4_ * auVar207._4_4_ + fVar195;
        auVar338._8_4_ = auVar167._8_4_ * auVar207._8_4_ + fVar182;
        auVar338._12_4_ = auVar167._12_4_ * auVar207._12_4_ + fVar195;
        auVar174._8_8_ = auVar132._0_8_;
        auVar174._0_8_ = auVar132._0_8_;
        auVar93 = vshufpd_avx(auVar132,auVar132,1);
        auVar93 = vsubps_avx(auVar93,auVar174);
        auVar133._0_4_ = auVar93._0_4_ * auVar207._0_4_ + fVar196;
        auVar133._4_4_ = auVar93._4_4_ * auVar207._4_4_ + fVar198;
        auVar133._8_4_ = auVar93._8_4_ * auVar207._8_4_ + fVar196;
        auVar133._12_4_ = auVar93._12_4_ * auVar207._12_4_ + fVar198;
        auVar207 = vmovshdup_avx(auVar133);
        auVar248._0_8_ = auVar207._0_8_ ^ 0x8000000080000000;
        auVar248._8_4_ = auVar207._8_4_ ^ 0x80000000;
        auVar248._12_4_ = auVar207._12_4_ ^ 0x80000000;
        auVar177 = vmovshdup_avx(auVar167);
        auVar93 = vunpcklps_avx(auVar177,auVar248);
        auVar139 = vshufps_avx(auVar93,auVar248,4);
        auVar98._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
        auVar98._8_4_ = -auVar167._8_4_;
        auVar98._12_4_ = -auVar167._12_4_;
        auVar93 = vmovlhps_avx(auVar98,auVar133);
        auVar128 = vshufps_avx(auVar93,auVar133,8);
        auVar93 = ZEXT416((uint)(auVar133._0_4_ * auVar177._0_4_ - auVar167._0_4_ * auVar207._0_4_))
        ;
        auVar207 = vshufps_avx(auVar93,auVar93,0);
        auVar93 = vdivps_avx(auVar139,auVar207);
        auVar207 = vdivps_avx(auVar128,auVar207);
        auVar128 = vinsertps_avx(auVar293,auVar351,0x1c);
        auVar167 = vinsertps_avx(auVar306,auVar355,0x1c);
        auVar129 = vinsertps_avx(auVar351,auVar293,0x4c);
        auVar267 = vinsertps_avx(auVar355,auVar306,0x4c);
        auVar177 = vmovsldup_avx(auVar93);
        auVar307._0_4_ = auVar128._0_4_ * auVar177._0_4_;
        auVar307._4_4_ = auVar128._4_4_ * auVar177._4_4_;
        auVar307._8_4_ = auVar128._8_4_ * auVar177._8_4_;
        auVar307._12_4_ = auVar128._12_4_ * auVar177._12_4_;
        auVar134._0_4_ = auVar177._0_4_ * auVar167._0_4_;
        auVar134._4_4_ = auVar177._4_4_ * auVar167._4_4_;
        auVar134._8_4_ = auVar177._8_4_ * auVar167._8_4_;
        auVar134._12_4_ = auVar177._12_4_ * auVar167._12_4_;
        auVar139 = vminps_avx(auVar307,auVar134);
        auVar177 = vmaxps_avx(auVar134,auVar307);
        auVar17 = vmovsldup_avx(auVar207);
        auVar356._0_4_ = auVar17._0_4_ * auVar129._0_4_;
        auVar356._4_4_ = auVar17._4_4_ * auVar129._4_4_;
        auVar356._8_4_ = auVar17._8_4_ * auVar129._8_4_;
        auVar356._12_4_ = auVar17._12_4_ * auVar129._12_4_;
        auVar308._0_4_ = auVar17._0_4_ * auVar267._0_4_;
        auVar308._4_4_ = auVar17._4_4_ * auVar267._4_4_;
        auVar308._8_4_ = auVar17._8_4_ * auVar267._8_4_;
        auVar308._12_4_ = auVar17._12_4_ * auVar267._12_4_;
        auVar17 = vminps_avx(auVar356,auVar308);
        auVar222._0_4_ = auVar139._0_4_ + auVar17._0_4_;
        auVar222._4_4_ = auVar139._4_4_ + auVar17._4_4_;
        auVar222._8_4_ = auVar139._8_4_ + auVar17._8_4_;
        auVar222._12_4_ = auVar139._12_4_ + auVar17._12_4_;
        auVar139 = vmaxps_avx(auVar308,auVar356);
        auVar17 = vsubps_avx(auVar321,auVar193);
        auVar74 = vsubps_avx(auVar326,auVar193);
        auVar135._0_4_ = auVar139._0_4_ + auVar177._0_4_;
        auVar135._4_4_ = auVar139._4_4_ + auVar177._4_4_;
        auVar135._8_4_ = auVar139._8_4_ + auVar177._8_4_;
        auVar135._12_4_ = auVar139._12_4_ + auVar177._12_4_;
        auVar327._8_8_ = 0x3f800000;
        auVar327._0_8_ = 0x3f800000;
        auVar177 = vsubps_avx(auVar327,auVar135);
        auVar139 = vsubps_avx(auVar327,auVar222);
        fVar233 = auVar17._0_4_;
        auVar328._0_4_ = fVar233 * auVar177._0_4_;
        fVar235 = auVar17._4_4_;
        auVar328._4_4_ = fVar235 * auVar177._4_4_;
        fVar111 = auVar17._8_4_;
        auVar328._8_4_ = fVar111 * auVar177._8_4_;
        fVar112 = auVar17._12_4_;
        auVar328._12_4_ = fVar112 * auVar177._12_4_;
        fVar196 = auVar74._0_4_;
        auVar136._0_4_ = fVar196 * auVar177._0_4_;
        fVar198 = auVar74._4_4_;
        auVar136._4_4_ = fVar198 * auVar177._4_4_;
        fVar201 = auVar74._8_4_;
        auVar136._8_4_ = fVar201 * auVar177._8_4_;
        fVar231 = auVar74._12_4_;
        auVar136._12_4_ = fVar231 * auVar177._12_4_;
        auVar352._0_4_ = fVar233 * auVar139._0_4_;
        auVar352._4_4_ = fVar235 * auVar139._4_4_;
        auVar352._8_4_ = fVar111 * auVar139._8_4_;
        auVar352._12_4_ = fVar112 * auVar139._12_4_;
        auVar223._0_4_ = fVar196 * auVar139._0_4_;
        auVar223._4_4_ = fVar198 * auVar139._4_4_;
        auVar223._8_4_ = fVar201 * auVar139._8_4_;
        auVar223._12_4_ = fVar231 * auVar139._12_4_;
        auVar177 = vminps_avx(auVar328,auVar352);
        auVar139 = vminps_avx(auVar136,auVar223);
        auVar17 = vminps_avx(auVar177,auVar139);
        auVar177 = vmaxps_avx(auVar352,auVar328);
        auVar139 = vmaxps_avx(auVar223,auVar136);
        auVar74 = vshufps_avx(auVar193,auVar193,0x54);
        auVar139 = vmaxps_avx(auVar139,auVar177);
        auVar75 = vshufps_avx(auVar338,auVar338,0);
        auVar117 = vshufps_avx(auVar338,auVar338,0x55);
        auVar177 = vhaddps_avx(auVar17,auVar17);
        auVar139 = vhaddps_avx(auVar139,auVar139);
        auVar224._0_4_ = auVar117._0_4_ * auVar207._0_4_ + auVar75._0_4_ * auVar93._0_4_;
        auVar224._4_4_ = auVar117._4_4_ * auVar207._4_4_ + auVar75._4_4_ * auVar93._4_4_;
        auVar224._8_4_ = auVar117._8_4_ * auVar207._8_4_ + auVar75._8_4_ * auVar93._8_4_;
        auVar224._12_4_ = auVar117._12_4_ * auVar207._12_4_ + auVar75._12_4_ * auVar93._12_4_;
        auVar17 = vsubps_avx(auVar74,auVar224);
        fVar182 = auVar17._0_4_ + auVar177._0_4_;
        fVar195 = auVar17._0_4_ + auVar139._0_4_;
        auVar177 = vmaxss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar182));
        auVar139 = vminss_avx(ZEXT416((uint)fVar195),ZEXT416((uint)fVar116));
      } while (auVar139._0_4_ < auVar177._0_4_);
      auVar177 = vmovshdup_avx(auVar93);
      auVar225._0_4_ = auVar128._0_4_ * auVar177._0_4_;
      auVar225._4_4_ = auVar128._4_4_ * auVar177._4_4_;
      auVar225._8_4_ = auVar128._8_4_ * auVar177._8_4_;
      auVar225._12_4_ = auVar128._12_4_ * auVar177._12_4_;
      auVar137._0_4_ = auVar177._0_4_ * auVar167._0_4_;
      auVar137._4_4_ = auVar177._4_4_ * auVar167._4_4_;
      auVar137._8_4_ = auVar177._8_4_ * auVar167._8_4_;
      auVar137._12_4_ = auVar177._12_4_ * auVar167._12_4_;
      auVar139 = vminps_avx(auVar225,auVar137);
      auVar177 = vmaxps_avx(auVar137,auVar225);
      auVar128 = vmovshdup_avx(auVar207);
      auVar99._0_4_ = auVar128._0_4_ * auVar129._0_4_;
      auVar99._4_4_ = auVar128._4_4_ * auVar129._4_4_;
      auVar99._8_4_ = auVar128._8_4_ * auVar129._8_4_;
      auVar99._12_4_ = auVar128._12_4_ * auVar129._12_4_;
      auVar226._0_4_ = auVar267._0_4_ * auVar128._0_4_;
      auVar226._4_4_ = auVar267._4_4_ * auVar128._4_4_;
      auVar226._8_4_ = auVar267._8_4_ * auVar128._8_4_;
      auVar226._12_4_ = auVar267._12_4_ * auVar128._12_4_;
      auVar128 = vminps_avx(auVar99,auVar226);
      auVar175._0_4_ = auVar139._0_4_ + auVar128._0_4_;
      auVar175._4_4_ = auVar139._4_4_ + auVar128._4_4_;
      auVar175._8_4_ = auVar139._8_4_ + auVar128._8_4_;
      auVar175._12_4_ = auVar139._12_4_ + auVar128._12_4_;
      auVar139 = vmaxps_avx(auVar226,auVar99);
      auVar100._0_4_ = auVar177._0_4_ + auVar139._0_4_;
      auVar100._4_4_ = auVar177._4_4_ + auVar139._4_4_;
      auVar100._8_4_ = auVar177._8_4_ + auVar139._8_4_;
      auVar100._12_4_ = auVar177._12_4_ + auVar139._12_4_;
      auVar177 = vsubps_avx(auVar264,auVar100);
      auVar139 = vsubps_avx(auVar264,auVar175);
      auVar176._0_4_ = fVar233 * auVar177._0_4_;
      auVar176._4_4_ = fVar235 * auVar177._4_4_;
      auVar176._8_4_ = fVar111 * auVar177._8_4_;
      auVar176._12_4_ = fVar112 * auVar177._12_4_;
      auVar227._0_4_ = fVar233 * auVar139._0_4_;
      auVar227._4_4_ = fVar235 * auVar139._4_4_;
      auVar227._8_4_ = fVar111 * auVar139._8_4_;
      auVar227._12_4_ = fVar112 * auVar139._12_4_;
      auVar101._0_4_ = fVar196 * auVar177._0_4_;
      auVar101._4_4_ = fVar198 * auVar177._4_4_;
      auVar101._8_4_ = fVar201 * auVar177._8_4_;
      auVar101._12_4_ = fVar231 * auVar177._12_4_;
      auVar138._0_4_ = fVar196 * auVar139._0_4_;
      auVar138._4_4_ = fVar198 * auVar139._4_4_;
      auVar138._8_4_ = fVar201 * auVar139._8_4_;
      auVar138._12_4_ = fVar231 * auVar139._12_4_;
      auVar177 = vminps_avx(auVar176,auVar227);
      auVar139 = vminps_avx(auVar101,auVar138);
      auVar177 = vminps_avx(auVar177,auVar139);
      auVar139 = vmaxps_avx(auVar227,auVar176);
      auVar128 = vmaxps_avx(auVar138,auVar101);
      auVar177 = vhaddps_avx(auVar177,auVar177);
      auVar139 = vmaxps_avx(auVar128,auVar139);
      auVar139 = vhaddps_avx(auVar139,auVar139);
      auVar128 = vmovshdup_avx(auVar17);
      auVar167 = ZEXT416((uint)(auVar128._0_4_ + auVar177._0_4_));
      auVar177 = vmaxss_avx(auVar89,auVar167);
      auVar128 = ZEXT416((uint)(auVar128._0_4_ + auVar139._0_4_));
      auVar139 = vminss_avx(auVar128,auVar73);
      auVar357._8_4_ = 0x7fffffff;
      auVar357._0_8_ = 0x7fffffff7fffffff;
      auVar357._12_4_ = 0x7fffffff;
    } while (auVar139._0_4_ < auVar177._0_4_);
    uVar70 = 0;
    if ((fVar150 < fVar182) && (fVar195 < fVar116)) {
      auVar177 = vcmpps_avx(auVar128,auVar73,1);
      auVar139 = vcmpps_avx(auVar89,auVar167,1);
      auVar177 = vandps_avx(auVar139,auVar177);
      uVar70 = auVar177._0_4_;
    }
    if ((3 < uVar69 || fVar149 < 0.001) || (uVar70 & 1) != 0) {
      lVar66 = 200;
      do {
        fVar149 = auVar17._0_4_;
        fVar116 = 1.0 - fVar149;
        auVar177 = ZEXT416((uint)(fVar116 * fVar116 * fVar116));
        auVar177 = vshufps_avx(auVar177,auVar177,0);
        auVar139 = ZEXT416((uint)(fVar149 * 3.0 * fVar116 * fVar116));
        auVar139 = vshufps_avx(auVar139,auVar139,0);
        auVar128 = ZEXT416((uint)(fVar116 * fVar149 * fVar149 * 3.0));
        auVar128 = vshufps_avx(auVar128,auVar128,0);
        auVar167 = ZEXT416((uint)(fVar149 * fVar149 * fVar149));
        auVar167 = vshufps_avx(auVar167,auVar167,0);
        fVar116 = (float)local_5c8._0_4_ * auVar177._0_4_ +
                  local_548 * auVar139._0_4_ +
                  (float)local_3d8._0_4_ * auVar167._0_4_ + local_558 * auVar128._0_4_;
        fVar149 = (float)local_5c8._4_4_ * auVar177._4_4_ +
                  fStack_544 * auVar139._4_4_ +
                  (float)local_3d8._4_4_ * auVar167._4_4_ + fStack_554 * auVar128._4_4_;
        auVar102._0_8_ = CONCAT44(fVar149,fVar116);
        auVar102._8_4_ =
             fStack_5c0 * auVar177._8_4_ +
             fStack_540 * auVar139._8_4_ + fStack_3d0 * auVar167._8_4_ + fStack_550 * auVar128._8_4_
        ;
        auVar102._12_4_ =
             fStack_5bc * auVar177._12_4_ +
             fStack_53c * auVar139._12_4_ +
             fStack_3cc * auVar167._12_4_ + fStack_54c * auVar128._12_4_;
        auVar140._8_8_ = auVar102._0_8_;
        auVar140._0_8_ = auVar102._0_8_;
        auVar139 = vshufpd_avx(auVar102,auVar102,1);
        auVar177 = vmovshdup_avx(auVar17);
        auVar139 = vsubps_avx(auVar139,auVar140);
        auVar103._0_4_ = auVar177._0_4_ * auVar139._0_4_ + fVar116;
        auVar103._4_4_ = auVar177._4_4_ * auVar139._4_4_ + fVar149;
        auVar103._8_4_ = auVar177._8_4_ * auVar139._8_4_ + fVar116;
        auVar103._12_4_ = auVar177._12_4_ * auVar139._12_4_ + fVar149;
        auVar177 = vshufps_avx(auVar103,auVar103,0);
        auVar139 = vshufps_avx(auVar103,auVar103,0x55);
        auVar141._0_4_ = auVar93._0_4_ * auVar177._0_4_ + auVar207._0_4_ * auVar139._0_4_;
        auVar141._4_4_ = auVar93._4_4_ * auVar177._4_4_ + auVar207._4_4_ * auVar139._4_4_;
        auVar141._8_4_ = auVar93._8_4_ * auVar177._8_4_ + auVar207._8_4_ * auVar139._8_4_;
        auVar141._12_4_ = auVar93._12_4_ * auVar177._12_4_ + auVar207._12_4_ * auVar139._12_4_;
        auVar17 = vsubps_avx(auVar17,auVar141);
        auVar177 = vandps_avx(auVar357,auVar103);
        auVar139 = vshufps_avx(auVar177,auVar177,0xf5);
        auVar177 = vmaxss_avx(auVar139,auVar177);
        if (auVar177._0_4_ < (float)local_3e8._0_4_) {
          fVar116 = auVar17._0_4_;
          if ((0.0 <= fVar116) && (fVar116 <= 1.0)) {
            auVar93 = vmovshdup_avx(auVar17);
            fVar149 = auVar93._0_4_;
            if ((0.0 <= fVar149) && (fVar149 <= 1.0)) {
              auVar93 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar267 = vinsertps_avx(auVar93,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                       0x28);
              auVar93 = vdpps_avx(auVar267,local_268,0x7f);
              auVar207 = vdpps_avx(auVar267,local_278,0x7f);
              auVar177 = vdpps_avx(auVar267,local_2a8,0x7f);
              auVar139 = vdpps_avx(auVar267,local_2b8,0x7f);
              auVar128 = vdpps_avx(auVar267,local_2c8,0x7f);
              auVar167 = vdpps_avx(auVar267,local_2d8,0x7f);
              fVar198 = 1.0 - fVar149;
              auVar129 = vdpps_avx(auVar267,local_288,0x7f);
              auVar267 = vdpps_avx(auVar267,local_298,0x7f);
              fVar201 = 1.0 - fVar116;
              fVar150 = auVar17._4_4_;
              fVar182 = auVar17._8_4_;
              fVar195 = auVar17._12_4_;
              fVar196 = fVar201 * fVar116 * fVar116 * 3.0;
              auVar249._0_4_ = fVar116 * fVar116 * fVar116;
              auVar249._4_4_ = fVar150 * fVar150 * fVar150;
              auVar249._8_4_ = fVar182 * fVar182 * fVar182;
              auVar249._12_4_ = fVar195 * fVar195 * fVar195;
              fVar150 = fVar116 * 3.0 * fVar201 * fVar201;
              fVar182 = fVar201 * fVar201 * fVar201;
              fVar116 = (fVar198 * auVar93._0_4_ + fVar149 * auVar177._0_4_) * fVar182 +
                        (fVar198 * auVar207._0_4_ + fVar149 * auVar139._0_4_) * fVar150 +
                        fVar196 * (fVar198 * auVar129._0_4_ + fVar149 * auVar128._0_4_) +
                        auVar249._0_4_ * (auVar167._0_4_ * fVar149 + fVar198 * auVar267._0_4_);
              if ((fVar115 <= fVar116) &&
                 (fVar149 = *(float *)(ray + k * 4 + 0x80), fVar116 <= fVar149)) {
                pGVar9 = (context->scene->geometries).items[uVar64].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  bVar72 = false;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar72 = true, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_1a8 = vshufps_avx(auVar17,auVar17,0x55);
                  auVar294._8_4_ = 0x3f800000;
                  auVar294._0_8_ = 0x3f8000003f800000;
                  auVar294._12_4_ = 0x3f800000;
                  auVar93 = vsubps_avx(auVar294,local_1a8);
                  fVar195 = local_1a8._0_4_;
                  fVar198 = local_1a8._4_4_;
                  fVar231 = local_1a8._8_4_;
                  fVar233 = local_1a8._12_4_;
                  fVar235 = auVar93._0_4_;
                  fVar111 = auVar93._4_4_;
                  fVar112 = auVar93._8_4_;
                  fVar113 = auVar93._12_4_;
                  auVar309._0_4_ =
                       fVar195 * (float)local_418._0_4_ + fVar235 * (float)local_3f8._0_4_;
                  auVar309._4_4_ =
                       fVar198 * (float)local_418._4_4_ + fVar111 * (float)local_3f8._4_4_;
                  auVar309._8_4_ = fVar231 * fStack_410 + fVar112 * fStack_3f0;
                  auVar309._12_4_ = fVar233 * fStack_40c + fVar113 * fStack_3ec;
                  auVar322._0_4_ = fVar195 * (float)local_428._0_4_ + fVar235 * fVar234;
                  auVar322._4_4_ = fVar198 * (float)local_428._4_4_ + fVar111 * fVar236;
                  auVar322._8_4_ = fVar231 * fStack_420 + fVar112 * fVar254;
                  auVar322._12_4_ = fVar233 * fStack_41c + fVar113 * fVar256;
                  auVar329._0_4_ = fVar195 * fVar252 + fVar235 * (float)local_408._0_4_;
                  auVar329._4_4_ = fVar198 * fVar255 + fVar111 * (float)local_408._4_4_;
                  auVar329._8_4_ = fVar231 * fVar199 + fVar112 * fStack_400;
                  auVar329._12_4_ = fVar233 * fVar232 + fVar113 * fStack_3fc;
                  auVar295._0_4_ = fVar195 * (float)local_308._0_4_ + fVar235 * fVar237;
                  auVar295._4_4_ = fVar198 * (float)local_308._4_4_ + fVar111 * fVar253;
                  auVar295._8_4_ = fVar231 * fStack_300 + fVar112 * fVar197;
                  auVar295._12_4_ = fVar233 * fStack_2fc + fVar113 * fVar202;
                  auVar139 = vsubps_avx(auVar322,auVar309);
                  auVar128 = vsubps_avx(auVar329,auVar322);
                  auVar167 = vsubps_avx(auVar295,auVar329);
                  local_1b8 = vshufps_avx(auVar17,auVar17,0);
                  fVar195 = local_1b8._0_4_;
                  fVar231 = local_1b8._4_4_;
                  fVar233 = local_1b8._8_4_;
                  fVar111 = local_1b8._12_4_;
                  auVar93 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
                  fVar198 = auVar93._0_4_;
                  fVar201 = auVar93._4_4_;
                  fVar235 = auVar93._8_4_;
                  fVar112 = auVar93._12_4_;
                  auVar93 = vshufps_avx(auVar249,auVar249,0);
                  auVar207 = vshufps_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar196),0);
                  auVar177 = vshufps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150),0);
                  auVar228._0_4_ =
                       ((auVar128._0_4_ * fVar198 + auVar167._0_4_ * fVar195) * fVar195 +
                       (auVar139._0_4_ * fVar198 + auVar128._0_4_ * fVar195) * fVar198) * 3.0;
                  auVar228._4_4_ =
                       ((auVar128._4_4_ * fVar201 + auVar167._4_4_ * fVar231) * fVar231 +
                       (auVar139._4_4_ * fVar201 + auVar128._4_4_ * fVar231) * fVar201) * 3.0;
                  auVar228._8_4_ =
                       ((auVar128._8_4_ * fVar235 + auVar167._8_4_ * fVar233) * fVar233 +
                       (auVar139._8_4_ * fVar235 + auVar128._8_4_ * fVar233) * fVar235) * 3.0;
                  auVar228._12_4_ =
                       ((auVar128._12_4_ * fVar112 + auVar167._12_4_ * fVar111) * fVar111 +
                       (auVar139._12_4_ * fVar112 + auVar128._12_4_ * fVar111) * fVar112) * 3.0;
                  auVar139 = vshufps_avx(ZEXT416((uint)fVar182),ZEXT416((uint)fVar182),0);
                  auVar142._0_4_ =
                       auVar139._0_4_ * (float)local_338._0_4_ +
                       auVar177._0_4_ * (float)local_348._0_4_ +
                       auVar93._0_4_ * (float)local_368._0_4_ +
                       auVar207._0_4_ * (float)local_358._0_4_;
                  auVar142._4_4_ =
                       auVar139._4_4_ * (float)local_338._4_4_ +
                       auVar177._4_4_ * (float)local_348._4_4_ +
                       auVar93._4_4_ * (float)local_368._4_4_ +
                       auVar207._4_4_ * (float)local_358._4_4_;
                  auVar142._8_4_ =
                       auVar139._8_4_ * fStack_330 +
                       auVar177._8_4_ * fStack_340 +
                       auVar93._8_4_ * fStack_360 + auVar207._8_4_ * fStack_350;
                  auVar142._12_4_ =
                       auVar139._12_4_ * fStack_32c +
                       auVar177._12_4_ * fStack_33c +
                       auVar93._12_4_ * fStack_35c + auVar207._12_4_ * fStack_34c;
                  auVar93 = vshufps_avx(auVar228,auVar228,0xc9);
                  auVar178._0_4_ = auVar142._0_4_ * auVar93._0_4_;
                  auVar178._4_4_ = auVar142._4_4_ * auVar93._4_4_;
                  auVar178._8_4_ = auVar142._8_4_ * auVar93._8_4_;
                  auVar178._12_4_ = auVar142._12_4_ * auVar93._12_4_;
                  auVar93 = vshufps_avx(auVar142,auVar142,0xc9);
                  auVar143._0_4_ = auVar228._0_4_ * auVar93._0_4_;
                  auVar143._4_4_ = auVar228._4_4_ * auVar93._4_4_;
                  auVar143._8_4_ = auVar228._8_4_ * auVar93._8_4_;
                  auVar143._12_4_ = auVar228._12_4_ * auVar93._12_4_;
                  auVar207 = vsubps_avx(auVar143,auVar178);
                  auVar93 = vshufps_avx(auVar207,auVar207,0x55);
                  local_1e8[0] = (RTCHitN)auVar93[0];
                  local_1e8[1] = (RTCHitN)auVar93[1];
                  local_1e8[2] = (RTCHitN)auVar93[2];
                  local_1e8[3] = (RTCHitN)auVar93[3];
                  local_1e8[4] = (RTCHitN)auVar93[4];
                  local_1e8[5] = (RTCHitN)auVar93[5];
                  local_1e8[6] = (RTCHitN)auVar93[6];
                  local_1e8[7] = (RTCHitN)auVar93[7];
                  local_1e8[8] = (RTCHitN)auVar93[8];
                  local_1e8[9] = (RTCHitN)auVar93[9];
                  local_1e8[10] = (RTCHitN)auVar93[10];
                  local_1e8[0xb] = (RTCHitN)auVar93[0xb];
                  local_1e8[0xc] = (RTCHitN)auVar93[0xc];
                  local_1e8[0xd] = (RTCHitN)auVar93[0xd];
                  local_1e8[0xe] = (RTCHitN)auVar93[0xe];
                  local_1e8[0xf] = (RTCHitN)auVar93[0xf];
                  local_1d8 = vshufps_avx(auVar207,auVar207,0xaa);
                  local_1c8 = vshufps_avx(auVar207,auVar207,0);
                  local_198 = local_328._0_8_;
                  uStack_190 = local_328._8_8_;
                  local_188 = local_318._0_8_;
                  uStack_180 = local_318._8_8_;
                  vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                  uStack_174 = context->user->instID[0];
                  local_178 = uStack_174;
                  uStack_170 = uStack_174;
                  uStack_16c = uStack_174;
                  uStack_168 = context->user->instPrimID[0];
                  uStack_164 = uStack_168;
                  uStack_160 = uStack_168;
                  uStack_15c = uStack_168;
                  *(float *)(ray + k * 4 + 0x80) = fVar116;
                  local_448 = *local_438;
                  local_3b8.valid = (int *)local_448;
                  local_3b8.geometryUserPtr = pGVar9->userPtr;
                  local_3b8.context = context->user;
                  local_3b8.ray = (RTCRayN *)ray;
                  local_3b8.hit = local_1e8;
                  local_3b8.N = 4;
                  local_388._0_4_ = (int)uVar65;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_3b8);
                    uVar65 = (ulong)(uint)local_388._0_4_;
                  }
                  if (local_448 == (undefined1  [16])0x0) {
                    auVar93 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar93 = auVar93 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var14)(&local_3b8);
                      uVar65 = (ulong)(uint)local_388._0_4_;
                    }
                    auVar207 = vpcmpeqd_avx(local_448,_DAT_01f7aa10);
                    auVar93 = auVar207 ^ _DAT_01f7ae20;
                    auVar179._8_4_ = 0xff800000;
                    auVar179._0_8_ = 0xff800000ff800000;
                    auVar179._12_4_ = 0xff800000;
                    auVar207 = vblendvps_avx(auVar179,*(undefined1 (*) [16])(local_3b8.ray + 0x80),
                                             auVar207);
                    *(undefined1 (*) [16])(local_3b8.ray + 0x80) = auVar207;
                  }
                  auVar144._8_8_ = 0x100000001;
                  auVar144._0_8_ = 0x100000001;
                  bVar72 = (auVar144 & auVar93) != (undefined1  [16])0x0;
                  if (!bVar72) {
                    *(float *)(ray + k * 4 + 0x80) = fVar149;
                  }
                }
                uVar65 = CONCAT71((int7)(uVar65 >> 8),(byte)uVar65 | bVar72);
              }
            }
          }
          break;
        }
        lVar66 = lVar66 + -1;
      } while (lVar66 != 0);
      goto LAB_00f58f64;
    }
    local_2e8 = vinsertps_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar116),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }